

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_q3_K_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m256 x_00;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [32];
  undefined1 (*pauVar31) [32];
  undefined1 (*pauVar32) [32];
  undefined1 (*pauVar33) [32];
  undefined1 (*pauVar34) [32];
  undefined1 (*pauVar35) [32];
  undefined1 (*pauVar36) [32];
  undefined1 (*pauVar37) [32];
  undefined1 auVar38 [16];
  long in_RCX;
  long lVar39;
  float *in_RSI;
  ulong uVar40;
  int in_EDI;
  long in_R9;
  undefined1 auVar41 [32];
  float fVar42;
  float fVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  __m256i p16_3;
  __m256i p16_2;
  __m256i p16_1;
  __m256i p16_0;
  __m256i q8s_3;
  __m256i q8s_2;
  __m256i q8s_1;
  __m256i q8s_0;
  __m256i q8_3;
  __m256i q8_2;
  __m256i q8_1;
  __m256i q8_0;
  __m256i q3h_3;
  __m256i q3l_3;
  __m256i q3h_2;
  __m256i q3l_2;
  __m256i q3h_1;
  __m256i q3l_1;
  __m256i q3h_0;
  __m256i q3l_0;
  __m256i q3bits;
  int j;
  int is;
  int bit;
  __m256i sumi;
  __m256i hbits;
  __m256i scales [2];
  __m128i h_scales;
  __m128i l_scales;
  __m256i all_scales;
  __m128i scales128;
  int8_t *q8;
  uint8_t *q3;
  float d;
  int i;
  uint32_t aux [3];
  __m256 acc;
  __m128i m32;
  __m256i mone;
  __m256i m3;
  int nb;
  block_q8_K *y;
  block_q3_K *x;
  uint32_t kmask2;
  uint32_t kmask1;
  undefined8 in_stack_ffffffffffffec58;
  undefined8 in_stack_ffffffffffffec60;
  undefined8 in_stack_ffffffffffffec68;
  undefined8 in_stack_ffffffffffffec70;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  int local_106c;
  uint local_1064;
  undefined1 local_1060 [32];
  undefined8 local_1020 [4];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [32];
  undefined1 local_fa0 [16];
  undefined1 (*local_f88) [32];
  undefined1 (*local_f80) [32];
  float local_f78;
  int local_f74;
  undefined8 local_f70;
  uint local_f68;
  undefined1 local_f60 [32];
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  int local_ecc;
  long local_ec8;
  long local_ec0;
  undefined4 local_eb8;
  undefined4 local_eb4;
  float *local_e90;
  undefined1 local_e80 [32];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined1 local_d52;
  undefined1 local_d51;
  undefined1 (*local_d50) [32];
  undefined1 (*local_d48) [32];
  undefined1 (*local_d40) [32];
  undefined1 (*local_d38) [32];
  undefined1 (*local_d30) [32];
  undefined1 (*local_d28) [32];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [32];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [32];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [32];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c40 [32];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [32];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [32];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [32];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined4 local_a84;
  undefined1 local_a80 [32];
  uint local_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined4 local_a04;
  undefined1 local_a00 [32];
  uint local_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined4 local_984;
  undefined1 local_980 [32];
  uint local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined4 local_904;
  undefined1 local_900 [32];
  uint local_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  uint local_884;
  undefined1 local_880 [32];
  undefined4 local_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  uint local_804;
  undefined1 local_800 [32];
  undefined4 local_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  uint local_784;
  undefined1 local_780 [32];
  undefined4 local_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  uint local_704;
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4c1;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_22c;
  float *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  uint local_110;
  int local_10c;
  uint local_108;
  uint local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [16];
  undefined1 auStack_d0 [16];
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50 [16];
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_eb4 = 0x3030303;
  local_eb8 = 0xf0f0f0f;
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0xff;
  }
  local_ecc = in_EDI >> 8;
  local_d51 = 3;
  local_a1 = 3;
  local_a2 = 3;
  local_a3 = 3;
  local_a4 = 3;
  local_a5 = 3;
  local_a6 = 3;
  local_a7 = 3;
  local_a8 = 3;
  local_a9 = 3;
  local_aa = 3;
  local_ab = 3;
  local_ac = 3;
  local_ad = 3;
  local_ae = 3;
  local_af = 3;
  local_b0 = 3;
  local_b1 = 3;
  local_b2 = 3;
  local_b3 = 3;
  local_b4 = 3;
  local_b5 = 3;
  local_b6 = 3;
  local_b7 = 3;
  local_b8 = 3;
  local_b9 = 3;
  local_ba = 3;
  local_bb = 3;
  local_bc = 3;
  local_bd = 3;
  local_be = 3;
  local_bf = 3;
  local_c0 = 3;
  auVar1 = vpinsrb_avx(ZEXT116(3),3,1);
  auVar1 = vpinsrb_avx(auVar1,3,2);
  auVar1 = vpinsrb_avx(auVar1,3,3);
  auVar1 = vpinsrb_avx(auVar1,3,4);
  auVar1 = vpinsrb_avx(auVar1,3,5);
  auVar1 = vpinsrb_avx(auVar1,3,6);
  auVar1 = vpinsrb_avx(auVar1,3,7);
  auVar1 = vpinsrb_avx(auVar1,3,8);
  auVar1 = vpinsrb_avx(auVar1,3,9);
  auVar1 = vpinsrb_avx(auVar1,3,10);
  auVar1 = vpinsrb_avx(auVar1,3,0xb);
  auVar1 = vpinsrb_avx(auVar1,3,0xc);
  auVar1 = vpinsrb_avx(auVar1,3,0xd);
  auVar1 = vpinsrb_avx(auVar1,3,0xe);
  local_e0 = vpinsrb_avx(auVar1,3,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(3),3,1);
  auVar1 = vpinsrb_avx(auVar1,3,2);
  auVar1 = vpinsrb_avx(auVar1,3,3);
  auVar1 = vpinsrb_avx(auVar1,3,4);
  auVar1 = vpinsrb_avx(auVar1,3,5);
  auVar1 = vpinsrb_avx(auVar1,3,6);
  auVar1 = vpinsrb_avx(auVar1,3,7);
  auVar1 = vpinsrb_avx(auVar1,3,8);
  auVar1 = vpinsrb_avx(auVar1,3,9);
  auVar1 = vpinsrb_avx(auVar1,3,10);
  auVar1 = vpinsrb_avx(auVar1,3,0xb);
  auVar1 = vpinsrb_avx(auVar1,3,0xc);
  auVar1 = vpinsrb_avx(auVar1,3,0xd);
  auVar1 = vpinsrb_avx(auVar1,3,0xe);
  auStack_d0 = vpinsrb_avx(auVar1,3,0xf);
  local_f00 = local_e0._0_8_;
  uStack_ef8 = local_e0._8_8_;
  uStack_ef0 = auStack_d0._0_8_;
  uStack_ee8 = auStack_d0._8_8_;
  local_d52 = 1;
  local_51 = 1;
  local_52 = 1;
  local_53 = 1;
  local_54 = 1;
  local_55 = 1;
  local_56 = 1;
  local_57 = 1;
  local_58 = 1;
  local_59 = 1;
  local_5a = 1;
  local_5b = 1;
  local_5c = 1;
  local_5d = 1;
  local_5e = 1;
  local_5f = 1;
  local_60 = 1;
  local_61 = 1;
  local_62 = 1;
  local_63 = 1;
  local_64 = 1;
  local_65 = 1;
  local_66 = 1;
  local_67 = 1;
  local_68 = 1;
  local_69 = 1;
  local_6a = 1;
  local_6b = 1;
  local_6c = 1;
  local_6d = 1;
  local_6e = 1;
  local_6f = 1;
  local_70 = 1;
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  local_a0 = vpinsrb_avx(auVar1,1,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  auStack_90 = vpinsrb_avx(auVar1,1,0xf);
  local_f20 = local_a0._0_8_;
  uStack_f18 = local_a0._8_8_;
  uStack_f10 = auStack_90._0_8_;
  uStack_f08 = auStack_90._8_8_;
  local_4c1 = 0x20;
  local_31 = 0x20;
  local_32 = 0x20;
  local_33 = 0x20;
  local_34 = 0x20;
  local_35 = 0x20;
  local_36 = 0x20;
  local_37 = 0x20;
  local_38 = 0x20;
  local_39 = 0x20;
  local_3a = 0x20;
  local_3b = 0x20;
  local_3c = 0x20;
  local_3d = 0x20;
  local_3e = 0x20;
  local_3f = 0x20;
  local_40 = 0x20;
  auVar1 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar1 = vpinsrb_avx(auVar1,0x20,2);
  auVar1 = vpinsrb_avx(auVar1,0x20,3);
  auVar1 = vpinsrb_avx(auVar1,0x20,4);
  auVar1 = vpinsrb_avx(auVar1,0x20,5);
  auVar1 = vpinsrb_avx(auVar1,0x20,6);
  auVar1 = vpinsrb_avx(auVar1,0x20,7);
  auVar1 = vpinsrb_avx(auVar1,0x20,8);
  auVar1 = vpinsrb_avx(auVar1,0x20,9);
  auVar1 = vpinsrb_avx(auVar1,0x20,10);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xe);
  local_50 = vpinsrb_avx(auVar1,0x20,0xf);
  local_f30 = local_50._0_8_;
  uStack_f28 = local_50._8_8_;
  local_d80 = 0;
  uStack_d78 = 0;
  uStack_d70 = 0;
  uStack_d68 = 0;
  local_f60._0_16_ = ZEXT816(0);
  local_ec8 = in_R9;
  local_ec0 = in_RCX;
  local_e90 = in_RSI;
  for (local_f74 = 0; local_f60 = ZEXT1632(local_f60._0_16_), local_f74 < local_ecc;
      local_f74 = local_f74 + 1) {
    fVar43 = *(float *)(local_ec8 + (long)local_f74 * 0x124);
    fVar42 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_ec0 + 0x6c + (long)local_f74 * 0x6e));
    local_f78 = fVar43 * fVar42;
    local_f80 = (undefined1 (*) [32])(local_ec0 + 0x20 + (long)local_f74 * 0x6e);
    local_f88 = (undefined1 (*) [32])(local_ec8 + 4 + (long)local_f74 * 0x124);
    local_f68 = *(uint *)(local_ec0 + 0x68 + (long)local_f74 * 0x6e);
    local_f70 = *(undefined8 *)(local_ec0 + 0x60 + (long)local_f74 * 0x6e);
    uVar45 = local_f70;
    local_f70._4_4_ = (uint)((ulong)local_f70 >> 0x20);
    local_104 = local_f70._4_4_ >> 4 & 0xf0f0f0f | local_f68 >> 2 & 0x30303030;
    uVar40 = (ulong)local_104;
    local_108 = (uint)local_f70 >> 4 & 0xf0f0f0f | local_f68 & 0x30303030;
    local_10c = (local_f70._4_4_ & 0xf0f0f0f) + (local_f68 & 0xc0c0c0c) * 4;
    local_110 = (uint)local_f70 & 0xf0f0f0f | (local_f68 & 0x3030303) << 4;
    auVar1 = vpinsrd_avx(ZEXT416(local_110),local_10c,1);
    auVar1 = vpinsrd_avx(auVar1,local_108,2);
    local_120 = vpinsrd_avx(auVar1,local_104,3);
    auVar38 = local_120;
    local_f0 = local_120._0_8_;
    uStack_e8 = local_120._8_8_;
    local_100 = local_f30;
    uStack_f8 = uStack_f28;
    auVar1._8_8_ = uStack_f28;
    auVar1._0_8_ = local_f30;
    local_fa0 = vpsubb_avx(local_120,auVar1);
    auVar1 = local_fa0;
    local_270 = local_fa0._0_8_;
    uStack_268 = local_fa0._8_8_;
    local_fc0 = vpmovsxbw_avx2(local_fa0);
    auVar2 = local_fc0;
    local_fd0 = local_fc0._16_8_;
    uStack_fc8 = local_fc0._24_8_;
    local_4b0 = local_fc0._16_8_;
    uStack_4a8 = local_fc0._24_8_;
    local_1020[2] = local_fc0._16_8_;
    local_1020[3] = local_fc0._24_8_;
    local_1020[0] = local_fc0._16_8_;
    local_1020[1] = local_fc0._24_8_;
    local_4c0 = local_fe0;
    uStack_4b8 = uStack_fd8;
    local_ff0 = local_fe0;
    uStack_fe8 = uStack_fd8;
    local_1000 = local_fe0;
    uStack_ff8 = uStack_fd8;
    local_d28 = (undefined1 (*) [32])(local_ec0 + (long)local_f74 * 0x6e);
    uVar9 = *(undefined8 *)*local_d28;
    uVar10 = *(undefined8 *)(*local_d28 + 8);
    uVar11 = *(undefined8 *)(*local_d28 + 0x10);
    uVar12 = *(undefined8 *)(*local_d28 + 0x18);
    auVar24 = *local_d28;
    auVar23 = *local_d28;
    auVar22 = *local_d28;
    auVar13 = *local_d28;
    local_ac0 = 0;
    uStack_ab8 = 0;
    uStack_ab0 = 0;
    uStack_aa8 = 0;
    local_1060 = ZEXT1632(ZEXT816(0));
    local_1064 = 0;
    local_106c = 0;
    local_fc0 = auVar2;
    local_fa0 = auVar1;
    local_f70 = uVar45;
    local_120 = auVar38;
    while( true ) {
      if (1 < local_106c) break;
      local_d30 = local_f80;
      local_ae0 = *(undefined8 *)*local_f80;
      uStack_ad8 = *(undefined8 *)(*local_f80 + 8);
      uStack_ad0 = *(undefined8 *)(*local_f80 + 0x10);
      uStack_ac8 = *(undefined8 *)(*local_f80 + 0x18);
      auVar41 = *local_f80;
      auVar5 = *local_f80;
      auVar4 = *local_f80;
      auVar3 = *local_f80;
      local_f80 = local_f80 + 1;
      local_b00 = local_f00;
      uStack_af8 = uStack_ef8;
      uStack_af0 = uStack_ef0;
      uStack_ae8 = uStack_ee8;
      auVar2._8_8_ = uStack_ef8;
      auVar2._0_8_ = local_f00;
      auVar2._16_8_ = uStack_ef0;
      auVar2._24_8_ = uStack_ee8;
      auVar2 = vpand_avx2(auVar3,auVar2);
      local_8c0 = local_f20;
      uStack_8b8 = uStack_f18;
      uStack_8b0 = uStack_f10;
      uStack_8a8 = uStack_f08;
      local_8c4 = local_1064;
      auVar6._8_8_ = uStack_f18;
      auVar6._0_8_ = local_f20;
      auVar6._16_8_ = uStack_f10;
      auVar6._24_8_ = uStack_f08;
      local_c00 = vpsllw_avx2(auVar6,ZEXT416(local_1064));
      local_be0 = uVar9;
      uStack_bd8 = uVar10;
      uStack_bd0 = uVar11;
      uStack_bc8 = uVar12;
      local_700 = vpandn_avx2(auVar13,local_c00);
      local_704 = local_1064;
      local_900 = vpsrlw_avx2(local_700,ZEXT416(local_1064));
      local_904 = 2;
      auVar6 = vpsllw_avx2(local_900,ZEXT416(2));
      local_944 = local_1064 + 1;
      local_740 = local_ae0;
      uStack_738 = uStack_ad8;
      uStack_730 = uStack_ad0;
      uStack_728 = uStack_ac8;
      local_744 = 2;
      local_b20 = vpsrlw_avx2(auVar4,ZEXT416(2));
      local_b40 = local_f00;
      uStack_b38 = uStack_ef8;
      uStack_b30 = uStack_ef0;
      uStack_b28 = uStack_ee8;
      auVar3._8_8_ = uStack_ef8;
      auVar3._0_8_ = local_f00;
      auVar3._16_8_ = uStack_ef0;
      auVar3._24_8_ = uStack_ee8;
      auVar3 = vpand_avx2(local_b20,auVar3);
      local_940 = local_f20;
      uStack_938 = uStack_f18;
      uStack_930 = uStack_f10;
      uStack_928 = uStack_f08;
      auVar7._8_8_ = uStack_f18;
      auVar7._0_8_ = local_f20;
      auVar7._16_8_ = uStack_f10;
      auVar7._24_8_ = uStack_f08;
      local_c40 = vpsllw_avx2(auVar7,ZEXT416(local_944));
      local_c20 = uVar9;
      uStack_c18 = uVar10;
      uStack_c10 = uVar11;
      uStack_c08 = uVar12;
      local_780 = vpandn_avx2(auVar22,local_c40);
      local_784 = local_944;
      local_980 = vpsrlw_avx2(local_780,ZEXT416(local_944));
      local_984 = 2;
      auVar7 = vpsllw_avx2(local_980,ZEXT416(2));
      local_9c4 = local_1064 + 2;
      local_7c0 = local_ae0;
      uStack_7b8 = uStack_ad8;
      uStack_7b0 = uStack_ad0;
      uStack_7a8 = uStack_ac8;
      local_7c4 = 4;
      local_b60 = vpsrlw_avx2(auVar5,ZEXT416(4));
      local_b80 = local_f00;
      uStack_b78 = uStack_ef8;
      uStack_b70 = uStack_ef0;
      uStack_b68 = uStack_ee8;
      auVar4._8_8_ = uStack_ef8;
      auVar4._0_8_ = local_f00;
      auVar4._16_8_ = uStack_ef0;
      auVar4._24_8_ = uStack_ee8;
      auVar4 = vpand_avx2(local_b60,auVar4);
      local_9c0 = local_f20;
      uStack_9b8 = uStack_f18;
      uStack_9b0 = uStack_f10;
      uStack_9a8 = uStack_f08;
      auVar8._8_8_ = uStack_f18;
      auVar8._0_8_ = local_f20;
      auVar8._16_8_ = uStack_f10;
      auVar8._24_8_ = uStack_f08;
      local_c80 = vpsllw_avx2(auVar8,ZEXT416(local_9c4));
      local_c60 = uVar9;
      uStack_c58 = uVar10;
      uStack_c50 = uVar11;
      uStack_c48 = uVar12;
      local_800 = vpandn_avx2(auVar23,local_c80);
      local_804 = local_9c4;
      local_a00 = vpsrlw_avx2(local_800,ZEXT416(local_9c4));
      local_a04 = 2;
      auVar8 = vpsllw_avx2(local_a00,ZEXT416(2));
      local_a44 = local_1064 + 3;
      local_840 = local_ae0;
      uStack_838 = uStack_ad8;
      uStack_830 = uStack_ad0;
      uStack_828 = uStack_ac8;
      local_844 = 6;
      local_ba0 = vpsrlw_avx2(auVar41,ZEXT416(6));
      local_bc0 = local_f00;
      uStack_bb8 = uStack_ef8;
      uStack_bb0 = uStack_ef0;
      uStack_ba8 = uStack_ee8;
      auVar5._8_8_ = uStack_ef8;
      auVar5._0_8_ = local_f00;
      auVar5._16_8_ = uStack_ef0;
      auVar5._24_8_ = uStack_ee8;
      auVar5 = vpand_avx2(local_ba0,auVar5);
      local_a40 = local_f20;
      uStack_a38 = uStack_f18;
      uStack_a30 = uStack_f10;
      uStack_a28 = uStack_f08;
      auVar41._8_8_ = uStack_f18;
      auVar41._0_8_ = local_f20;
      auVar41._16_8_ = uStack_f10;
      auVar41._24_8_ = uStack_f08;
      local_cc0 = vpsllw_avx2(auVar41,ZEXT416(local_a44));
      local_ca0 = uVar9;
      uStack_c98 = uVar10;
      uStack_c90 = uVar11;
      uStack_c88 = uVar12;
      auVar41 = vpternlogq_avx512vl(auVar24,auVar24,auVar24,0xf);
      local_880 = vpand_avx2(auVar41,local_cc0);
      local_884 = local_a44;
      local_a80 = vpsrlw_avx2(local_880,ZEXT416(local_a44));
      local_a84 = 2;
      auVar41 = vpsllw_avx2(local_a80,ZEXT416(2));
      local_1064 = local_1064 + 4;
      local_d38 = local_f88;
      puVar25 = *local_f88;
      puVar26 = *local_f88;
      puVar27 = *local_f88;
      puVar28 = *local_f88;
      auVar15 = *local_f88;
      auVar14 = *local_f88;
      local_d40 = local_f88 + 1;
      pauVar29 = local_f88 + 1;
      pauVar30 = local_f88 + 1;
      pauVar31 = local_f88 + 1;
      local_d48 = local_f88 + 2;
      pauVar32 = local_f88 + 2;
      pauVar33 = local_f88 + 2;
      pauVar34 = local_f88 + 2;
      local_d50 = local_f88 + 3;
      pauVar35 = local_f88 + 3;
      pauVar36 = local_f88 + 3;
      pauVar37 = local_f88 + 3;
      local_f88 = local_f88 + 4;
      local_10e0 = auVar6._0_8_;
      uStack_10d8 = auVar6._8_8_;
      uStack_10d0 = auVar6._16_8_;
      uStack_10c8 = auVar6._24_8_;
      local_500 = local_10e0;
      uStack_4f8 = uStack_10d8;
      uStack_4f0 = uStack_10d0;
      uStack_4e8 = uStack_10c8;
      local_520 = *(undefined8 *)puVar25;
      uStack_518 = *(undefined8 *)(puVar26 + 8);
      uStack_510 = *(undefined8 *)(puVar27 + 0x10);
      uStack_508 = *(undefined8 *)(puVar28 + 0x18);
      auVar6 = vpmaddubsw_avx2(auVar6,auVar14);
      local_1120 = auVar7._0_8_;
      uStack_1118 = auVar7._8_8_;
      uStack_1110 = auVar7._16_8_;
      uStack_1108 = auVar7._24_8_;
      local_540 = local_1120;
      uStack_538 = uStack_1118;
      uStack_530 = uStack_1110;
      uStack_528 = uStack_1108;
      local_560 = *(undefined8 *)*local_d40;
      uStack_558 = *(undefined8 *)(*pauVar29 + 8);
      uStack_550 = *(undefined8 *)(*pauVar30 + 0x10);
      uStack_548 = *(undefined8 *)(*pauVar31 + 0x18);
      auVar7 = vpmaddubsw_avx2(auVar7,*local_d40);
      local_1160 = auVar8._0_8_;
      uStack_1158 = auVar8._8_8_;
      uStack_1150 = auVar8._16_8_;
      uStack_1148 = auVar8._24_8_;
      local_580 = local_1160;
      uStack_578 = uStack_1158;
      uStack_570 = uStack_1150;
      uStack_568 = uStack_1148;
      local_5a0 = *(undefined8 *)*local_d48;
      uStack_598 = *(undefined8 *)(*pauVar32 + 8);
      uStack_590 = *(undefined8 *)(*pauVar33 + 0x10);
      uStack_588 = *(undefined8 *)(*pauVar34 + 0x18);
      auVar8 = vpmaddubsw_avx2(auVar8,*local_d48);
      local_11a0 = auVar41._0_8_;
      uStack_1198 = auVar41._8_8_;
      uStack_1190 = auVar41._16_8_;
      uStack_1188 = auVar41._24_8_;
      local_5c0 = local_11a0;
      uStack_5b8 = uStack_1198;
      uStack_5b0 = uStack_1190;
      uStack_5a8 = uStack_1188;
      local_5e0 = *(undefined8 *)*local_d50;
      uStack_5d8 = *(undefined8 *)(*pauVar35 + 8);
      uStack_5d0 = *(undefined8 *)(*pauVar36 + 0x10);
      uStack_5c8 = *(undefined8 *)(*pauVar37 + 0x18);
      auVar41 = vpmaddubsw_avx2(auVar41,*local_d50);
      local_10c0 = auVar2._0_8_;
      uStack_10b8 = auVar2._8_8_;
      uStack_10b0 = auVar2._16_8_;
      uStack_10a8 = auVar2._24_8_;
      local_600 = local_10c0;
      uStack_5f8 = uStack_10b8;
      uStack_5f0 = uStack_10b0;
      uStack_5e8 = uStack_10a8;
      local_620 = *(undefined8 *)puVar25;
      uStack_618 = *(undefined8 *)(puVar26 + 8);
      uStack_610 = *(undefined8 *)(puVar27 + 0x10);
      uStack_608 = *(undefined8 *)(puVar28 + 0x18);
      auVar2 = vpmaddubsw_avx2(auVar2,auVar15);
      local_1100 = auVar3._0_8_;
      uStack_10f8 = auVar3._8_8_;
      uStack_10f0 = auVar3._16_8_;
      uStack_10e8 = auVar3._24_8_;
      local_640 = local_1100;
      uStack_638 = uStack_10f8;
      uStack_630 = uStack_10f0;
      uStack_628 = uStack_10e8;
      local_660 = *(undefined8 *)*local_d40;
      uStack_658 = *(undefined8 *)(*pauVar29 + 8);
      uStack_650 = *(undefined8 *)(*pauVar30 + 0x10);
      uStack_648 = *(undefined8 *)(*pauVar31 + 0x18);
      auVar3 = vpmaddubsw_avx2(auVar3,*local_d40);
      local_1140 = auVar4._0_8_;
      uStack_1138 = auVar4._8_8_;
      uStack_1130 = auVar4._16_8_;
      uStack_1128 = auVar4._24_8_;
      local_680 = local_1140;
      uStack_678 = uStack_1138;
      uStack_670 = uStack_1130;
      uStack_668 = uStack_1128;
      local_6a0 = *(undefined8 *)*local_d48;
      uStack_698 = *(undefined8 *)(*pauVar32 + 8);
      uStack_690 = *(undefined8 *)(*pauVar33 + 0x10);
      uStack_688 = *(undefined8 *)(*pauVar34 + 0x18);
      auVar4 = vpmaddubsw_avx2(auVar4,*local_d48);
      local_1180 = auVar5._0_8_;
      uStack_1178 = auVar5._8_8_;
      uStack_1170 = auVar5._16_8_;
      uStack_1168 = auVar5._24_8_;
      local_6c0 = local_1180;
      uStack_6b8 = uStack_1178;
      uStack_6b0 = uStack_1170;
      uStack_6a8 = uStack_1168;
      local_6e0 = *(undefined8 *)*local_d50;
      uStack_6d8 = *(undefined8 *)(*pauVar35 + 8);
      uStack_6d0 = *(undefined8 *)(*pauVar36 + 0x10);
      uStack_6c8 = *(undefined8 *)(*pauVar37 + 0x18);
      auVar5 = vpmaddubsw_avx2(auVar5,*local_d50);
      local_12c0 = auVar2._0_8_;
      uStack_12b8 = auVar2._8_8_;
      uStack_12b0 = auVar2._16_8_;
      uStack_12a8 = auVar2._24_8_;
      local_1240 = auVar6._0_8_;
      uStack_1238 = auVar6._8_8_;
      uStack_1230 = auVar6._16_8_;
      uStack_1228 = auVar6._24_8_;
      local_3c0 = local_12c0;
      uStack_3b8 = uStack_12b8;
      uStack_3b0 = uStack_12b0;
      uStack_3a8 = uStack_12a8;
      local_3e0 = local_1240;
      uStack_3d8 = uStack_1238;
      uStack_3d0 = uStack_1230;
      uStack_3c8 = uStack_1228;
      auVar2 = vpsubw_avx2(auVar2,auVar6);
      local_12e0 = auVar3._0_8_;
      uStack_12d8 = auVar3._8_8_;
      uStack_12d0 = auVar3._16_8_;
      uStack_12c8 = auVar3._24_8_;
      local_1260 = auVar7._0_8_;
      uStack_1258 = auVar7._8_8_;
      uStack_1250 = auVar7._16_8_;
      uStack_1248 = auVar7._24_8_;
      local_400 = local_12e0;
      uStack_3f8 = uStack_12d8;
      uStack_3f0 = uStack_12d0;
      uStack_3e8 = uStack_12c8;
      local_420 = local_1260;
      uStack_418 = uStack_1258;
      uStack_410 = uStack_1250;
      uStack_408 = uStack_1248;
      auVar3 = vpsubw_avx2(auVar3,auVar7);
      local_1300 = auVar4._0_8_;
      uStack_12f8 = auVar4._8_8_;
      uStack_12f0 = auVar4._16_8_;
      uStack_12e8 = auVar4._24_8_;
      local_1280 = auVar8._0_8_;
      uStack_1278 = auVar8._8_8_;
      uStack_1270 = auVar8._16_8_;
      uStack_1268 = auVar8._24_8_;
      local_440 = local_1300;
      uStack_438 = uStack_12f8;
      uStack_430 = uStack_12f0;
      uStack_428 = uStack_12e8;
      local_460 = local_1280;
      uStack_458 = uStack_1278;
      uStack_450 = uStack_1270;
      uStack_448 = uStack_1268;
      auVar4 = vpsubw_avx2(auVar4,auVar8);
      local_1320 = auVar5._0_8_;
      uStack_1318 = auVar5._8_8_;
      uStack_1310 = auVar5._16_8_;
      uStack_1308 = auVar5._24_8_;
      local_12a0 = auVar41._0_8_;
      uStack_1298 = auVar41._8_8_;
      uStack_1290 = auVar41._16_8_;
      uStack_1288 = auVar41._24_8_;
      local_480 = local_1320;
      uStack_478 = uStack_1318;
      uStack_470 = uStack_1310;
      uStack_468 = uStack_1308;
      local_4a0 = local_12a0;
      uStack_498 = uStack_1298;
      uStack_490 = uStack_1290;
      uStack_488 = uStack_1288;
      auVar5 = vpsubw_avx2(auVar5,auVar41);
      lVar39 = (long)local_106c;
      uVar45 = local_1020[lVar39 * 4];
      uVar47 = local_1020[lVar39 * 4 + 1];
      uVar49 = local_1020[lVar39 * 4 + 2];
      uVar50 = local_1020[lVar39 * 4 + 3];
      uVar44 = uVar45;
      uVar46 = uVar47;
      uVar48 = uVar49;
      in_stack_ffffffffffffec58 = uVar50;
      get_scale_shuffle_q3k((__m256i *)0x0,(int)uVar40);
      local_140 = uVar45;
      uStack_138 = uVar47;
      uStack_130 = uVar49;
      uStack_128 = in_stack_ffffffffffffec58;
      local_160 = uVar44;
      uStack_158 = uVar46;
      uStack_150 = uVar48;
      uStack_148 = uVar50;
      auVar21._8_8_ = uVar47;
      auVar21._0_8_ = uVar45;
      auVar21._16_8_ = uVar49;
      auVar21._24_8_ = in_stack_ffffffffffffec58;
      auVar20._8_8_ = uVar46;
      auVar20._0_8_ = uVar44;
      auVar20._16_8_ = uVar48;
      auVar20._24_8_ = uVar50;
      local_2c0 = vpshufb_avx2(auVar21,auVar20);
      local_12c0 = auVar2._0_8_;
      uStack_12b8 = auVar2._8_8_;
      uStack_12b0 = auVar2._16_8_;
      uStack_12a8 = auVar2._24_8_;
      local_2e0 = local_12c0;
      uStack_2d8 = uStack_12b8;
      uStack_2d0 = uStack_12b0;
      uStack_2c8 = uStack_12a8;
      auVar2 = vpmaddwd_avx2(local_2c0,auVar2);
      lVar39 = (long)local_106c;
      uVar45 = local_1020[lVar39 * 4];
      uVar47 = local_1020[lVar39 * 4 + 1];
      uVar49 = local_1020[lVar39 * 4 + 2];
      uVar50 = local_1020[lVar39 * 4 + 3];
      uVar44 = uVar50;
      in_stack_ffffffffffffec60 = uVar45;
      in_stack_ffffffffffffec68 = uVar47;
      in_stack_ffffffffffffec70 = uVar49;
      get_scale_shuffle_q3k((__m256i *)0x1,(int)uVar40);
      local_180 = in_stack_ffffffffffffec60;
      uStack_178 = in_stack_ffffffffffffec68;
      uStack_170 = in_stack_ffffffffffffec70;
      uStack_168 = uVar50;
      local_1a0 = uVar45;
      uStack_198 = uVar47;
      uStack_190 = uVar49;
      uStack_188 = uVar44;
      auVar19._8_8_ = in_stack_ffffffffffffec68;
      auVar19._0_8_ = in_stack_ffffffffffffec60;
      auVar19._16_8_ = in_stack_ffffffffffffec70;
      auVar19._24_8_ = uVar50;
      auVar18._8_8_ = uVar47;
      auVar18._0_8_ = uVar45;
      auVar18._16_8_ = uVar49;
      auVar18._24_8_ = uVar44;
      local_300 = vpshufb_avx2(auVar19,auVar18);
      local_12e0 = auVar3._0_8_;
      uStack_12d8 = auVar3._8_8_;
      uStack_12d0 = auVar3._16_8_;
      uStack_12c8 = auVar3._24_8_;
      local_320 = local_12e0;
      uStack_318 = uStack_12d8;
      uStack_310 = uStack_12d0;
      uStack_308 = uStack_12c8;
      auVar3 = vpmaddwd_avx2(local_300,auVar3);
      lVar39 = (long)local_106c;
      uVar45 = local_1020[lVar39 * 4];
      uVar47 = local_1020[lVar39 * 4 + 1];
      uVar49 = local_1020[lVar39 * 4 + 2];
      uVar50 = local_1020[lVar39 * 4 + 3];
      uVar44 = uVar45;
      uVar46 = uVar47;
      uVar48 = uVar49;
      uVar51 = uVar50;
      get_scale_shuffle_q3k((__m256i *)0x2,(int)uVar40);
      local_1c0 = uVar45;
      uStack_1b8 = uVar47;
      uStack_1b0 = uVar49;
      uStack_1a8 = uVar50;
      local_1e0 = uVar44;
      uStack_1d8 = uVar46;
      uStack_1d0 = uVar48;
      uStack_1c8 = uVar51;
      auVar17._8_8_ = uVar47;
      auVar17._0_8_ = uVar45;
      auVar17._16_8_ = uVar49;
      auVar17._24_8_ = uVar50;
      auVar16._8_8_ = uVar46;
      auVar16._0_8_ = uVar44;
      auVar16._16_8_ = uVar48;
      auVar16._24_8_ = uVar51;
      local_340 = vpshufb_avx2(auVar17,auVar16);
      local_1300 = auVar4._0_8_;
      uStack_12f8 = auVar4._8_8_;
      uStack_12f0 = auVar4._16_8_;
      uStack_12e8 = auVar4._24_8_;
      local_360 = local_1300;
      uStack_358 = uStack_12f8;
      uStack_350 = uStack_12f0;
      uStack_348 = uStack_12e8;
      auVar4 = vpmaddwd_avx2(local_340,auVar4);
      lVar39 = (long)local_106c;
      uVar45 = local_1020[lVar39 * 4];
      uVar47 = local_1020[lVar39 * 4 + 1];
      uVar49 = local_1020[lVar39 * 4 + 2];
      uVar50 = local_1020[lVar39 * 4 + 3];
      uVar44 = uVar45;
      uVar46 = uVar47;
      uVar48 = uVar49;
      uVar51 = uVar50;
      get_scale_shuffle_q3k((__m256i *)0x3,(int)uVar40);
      local_200 = uVar45;
      uStack_1f8 = uVar47;
      uStack_1f0 = uVar49;
      uStack_1e8 = uVar50;
      local_220 = uVar44;
      uStack_218 = uVar46;
      uStack_210 = uVar48;
      uStack_208 = uVar51;
      auVar15._8_8_ = uVar47;
      auVar15._0_8_ = uVar45;
      auVar15._16_8_ = uVar49;
      auVar15._24_8_ = uVar50;
      auVar14._8_8_ = uVar46;
      auVar14._0_8_ = uVar44;
      auVar14._16_8_ = uVar48;
      auVar14._24_8_ = uVar51;
      local_380 = vpshufb_avx2(auVar15,auVar14);
      local_1320 = auVar5._0_8_;
      uStack_1318 = auVar5._8_8_;
      uStack_1310 = auVar5._16_8_;
      uStack_1308 = auVar5._24_8_;
      local_3a0 = local_1320;
      uStack_398 = uStack_1318;
      uStack_390 = uStack_1310;
      uStack_388 = uStack_1308;
      auVar5 = vpmaddwd_avx2(local_380,auVar5);
      local_12c0 = auVar2._0_8_;
      uStack_12b8 = auVar2._8_8_;
      uStack_12b0 = auVar2._16_8_;
      uStack_12a8 = auVar2._24_8_;
      local_12e0 = auVar3._0_8_;
      uStack_12d8 = auVar3._8_8_;
      uStack_12d0 = auVar3._16_8_;
      uStack_12c8 = auVar3._24_8_;
      local_da0 = local_12c0;
      uStack_d98 = uStack_12b8;
      uStack_d90 = uStack_12b0;
      uStack_d88 = uStack_12a8;
      local_dc0 = local_12e0;
      uStack_db8 = uStack_12d8;
      uStack_db0 = uStack_12d0;
      uStack_da8 = uStack_12c8;
      auVar2 = vpaddd_avx2(auVar2,auVar3);
      local_1300 = auVar4._0_8_;
      uStack_12f8 = auVar4._8_8_;
      uStack_12f0 = auVar4._16_8_;
      uStack_12e8 = auVar4._24_8_;
      local_1320 = auVar5._0_8_;
      uStack_1318 = auVar5._8_8_;
      uStack_1310 = auVar5._16_8_;
      uStack_1308 = auVar5._24_8_;
      local_de0 = local_1300;
      uStack_dd8 = uStack_12f8;
      uStack_dd0 = uStack_12f0;
      uStack_dc8 = uStack_12e8;
      local_e00 = local_1320;
      uStack_df8 = uStack_1318;
      uStack_df0 = uStack_1310;
      uStack_de8 = uStack_1308;
      auVar3 = vpaddd_avx2(auVar4,auVar5);
      local_12c0 = auVar2._0_8_;
      uStack_12b8 = auVar2._8_8_;
      uStack_12b0 = auVar2._16_8_;
      uStack_12a8 = auVar2._24_8_;
      local_1300 = auVar3._0_8_;
      uStack_12f8 = auVar3._8_8_;
      uStack_12f0 = auVar3._16_8_;
      uStack_12e8 = auVar3._24_8_;
      local_e20 = local_12c0;
      uStack_e18 = uStack_12b8;
      uStack_e10 = uStack_12b0;
      uStack_e08 = uStack_12a8;
      local_e40 = local_1300;
      uStack_e38 = uStack_12f8;
      uStack_e30 = uStack_12f0;
      uStack_e28 = uStack_12e8;
      local_e80 = vpaddd_avx2(auVar2,auVar3);
      local_e60 = local_1060._0_8_;
      uStack_e58 = local_1060._8_8_;
      uStack_e50 = local_1060._16_8_;
      uStack_e48 = local_1060._24_8_;
      local_1060 = vpaddd_avx2(local_1060,local_e80);
      local_106c = local_106c + 1;
    }
    local_228 = &local_f78;
    local_260 = local_f78;
    local_ce0 = CONCAT44(local_f78,local_f78);
    uStack_cd8 = CONCAT44(local_f78,local_f78);
    uStack_cd0 = CONCAT44(local_f78,local_f78);
    uStack_cc8 = CONCAT44(local_f78,local_f78);
    local_2a0 = local_1060._0_8_;
    uStack_298 = local_1060._8_8_;
    uStack_290 = local_1060._16_8_;
    uStack_288 = local_1060._24_8_;
    local_d00 = vcvtdq2ps_avx(local_1060);
    local_d20 = local_f60._0_8_;
    uStack_d18 = local_f60._8_8_;
    uStack_d10 = local_f60._16_8_;
    uStack_d08 = local_f60._24_8_;
    auVar13._8_8_ = uStack_cd8;
    auVar13._0_8_ = local_ce0;
    auVar13._16_8_ = uStack_cd0;
    auVar13._24_8_ = uStack_cc8;
    local_f60._0_16_ = vfmadd213ps_fma(local_d00,auVar13,local_f60);
    fStack_25c = local_260;
    fStack_258 = local_260;
    fStack_254 = local_260;
    fStack_250 = local_260;
    fStack_24c = local_260;
    fStack_248 = local_260;
    fStack_244 = local_260;
    local_22c = local_260;
  }
  x_00[2] = (float)(int)in_stack_ffffffffffffec60;
  x_00[3] = (float)(int)((ulong)in_stack_ffffffffffffec60 >> 0x20);
  x_00[0] = (float)(int)in_stack_ffffffffffffec58;
  x_00[1] = (float)(int)((ulong)in_stack_ffffffffffffec58 >> 0x20);
  x_00[4] = (float)(int)in_stack_ffffffffffffec68;
  x_00[5] = (float)(int)((ulong)in_stack_ffffffffffffec68 >> 0x20);
  x_00[6] = (float)(int)in_stack_ffffffffffffec70;
  x_00[7] = (float)(int)((ulong)in_stack_ffffffffffffec70 >> 0x20);
  fVar43 = hsum_float_8(x_00);
  *local_e90 = fVar43;
  return;
}

Assistant:

void ggml_vec_dot_q3_K_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(n % QK_K == 0);
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const uint32_t kmask1 = 0x03030303;
    const uint32_t kmask2 = 0x0f0f0f0f;

    const block_q3_K * GGML_RESTRICT x = vx;
    const block_q8_K * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined(__ARM_FEATURE_SVE)

    uint32_t aux[3];
    uint32_t utmp[4];

    const int8_t m32 = 32;
    const int vector_length = svcntb()*8;
    const svuint8_t m3b_sv = svdup_n_u8(0x3);
    const svint32_t vzero_sv = svdup_n_s32(0);

    const svuint8_t m0_sv = svdup_n_u8(1);
    const svuint8_t m1_sv = svlsl_n_u8_x(svptrue_b8(), m0_sv, 1);
    const svuint8_t m2_sv = svlsl_n_u8_x(svptrue_b8(), m0_sv, 2);
    const svuint8_t m3_sv = svlsl_n_u8_x(svptrue_b8(), m0_sv, 3);

    float sum = 0;

    for (int i = 0; i < nb; ++i) {

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT q3_sv = x[i].qs;
        const uint8_t * GGML_RESTRICT qh_sv = x[i].hmask;
        const int8_t  * GGML_RESTRICT q8_sv = y[i].qs;

        // Set up scales
        memcpy(aux, x[i].scales, 12);
        utmp[3] = ((aux[1] >> 4) & kmask2) | (((aux[2] >> 6) & kmask1) << 4);
        utmp[2] = ((aux[0] >> 4) & kmask2) | (((aux[2] >> 4) & kmask1) << 4);
        utmp[1] = (aux[1] & kmask2) | (((aux[2] >> 2) & kmask1) << 4);
        utmp[0] = (aux[0] & kmask2) | (((aux[2] >> 0) & kmask1) << 4);

        int8_t * scale = (int8_t *)utmp;

        for (int j = 0; j < 16; ++j) scale[j] -= m32;

        switch (vector_length) {
            case 128:
                {
                    svuint8_t qhbits_sv_1 = svld1_u8(svptrue_b8(), qh_sv);
                    svuint8_t qhbits_sv_2 = svld1_u8(svptrue_b8(), qh_sv+16);
                    svuint8_t q3h_sv;

                    svint32_t sumi1_1 = svdup_n_s32(0);
                    svint8_t q3bytes_sv;

                    for (int j = 0; j < QK_K/128; ++j) {

                        const svuint8_t q3bits_sv = svld1_u8(svptrue_b8(), q3_sv); q3_sv += 16;
                        const svuint8_t q3bits_sv_1 = svld1_u8(svptrue_b8(), q3_sv); q3_sv += 16;
                        svint8_t q8bytes_1_sv_1 = svld1_s8(svptrue_b8(), q8_sv); q8_sv += 16;
                        svint8_t q8bytes_1_sv_2 = svld1_s8(svptrue_b8(), q8_sv); q8_sv += 16;

                        q3h_sv = svlsl_n_u8_x(svptrue_b8(), svbic_u8_x(svptrue_b8(), m0_sv, qhbits_sv_1), 2);
                        q3bytes_sv = svsub_s8_x(svptrue_b8(), svreinterpret_s8_u8(svand_u8_m(svptrue_b8(), q3bits_sv, m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        sumi1_1 = svmla_s32_m(svptrue_b32(), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_1), svdup_n_s32((int32_t)scale[0]));

                        q3h_sv = svlsl_n_u8_x(svptrue_b8(), svbic_u8_x(svptrue_b8(), m0_sv, qhbits_sv_2), 2);
                        q3bytes_sv = svsub_s8_x(svptrue_b8(), svreinterpret_s8_u8(svand_u8_m(svptrue_b8(), q3bits_sv_1, m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        sumi1_1 = svmla_s32_m(svptrue_b32(), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_2), svdup_n_s32((int32_t)scale[1]));

                        q8bytes_1_sv_1 = svld1_s8(svptrue_b8(), q8_sv); q8_sv += 16;
                        q8bytes_1_sv_2 = svld1_s8(svptrue_b8(), q8_sv); q8_sv += 16;

                        q3h_sv = svlsl_n_u8_x(svptrue_b8(), svbic_u8_x(svptrue_b8(), m1_sv, qhbits_sv_1), 1);
                        q3bytes_sv = svsub_s8_x(svptrue_b8(), svreinterpret_s8_u8(svand_u8_m(svptrue_b8(), svlsr_n_u8_x(svptrue_b8(), q3bits_sv, 2), m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        sumi1_1 = svmla_s32_m(svptrue_b32(), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_1), svdup_n_s32((int32_t)scale[2]));

                        q3h_sv = svlsl_n_u8_x(svptrue_b8(), svbic_u8_x(svptrue_b8(), m1_sv, qhbits_sv_2), 1);
                        q3bytes_sv = svsub_s8_x(svptrue_b8(), svreinterpret_s8_u8(svand_u8_m(svptrue_b8(), svlsr_n_u8_x(svptrue_b8(), q3bits_sv_1, 2), m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        sumi1_1 = svmla_s32_m(svptrue_b32(), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_2), svdup_n_s32((int32_t)scale[3]));


                        scale += 4;
                        q8bytes_1_sv_1 = svld1_s8(svptrue_b8(), q8_sv); q8_sv += 16;
                        q8bytes_1_sv_2 = svld1_s8(svptrue_b8(), q8_sv); q8_sv += 16;

                        q3h_sv = svbic_u8_x(svptrue_b8(), m2_sv, qhbits_sv_1);
                        q3bytes_sv = svsub_s8_x(svptrue_b8(), svreinterpret_s8_u8(svand_u8_m(svptrue_b8(), svlsr_n_u8_x(svptrue_b8(), q3bits_sv, 4), m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        sumi1_1 = svmla_s32_m(svptrue_b32(), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_1), svdup_n_s32((int32_t)scale[0]));

                        q3h_sv = svbic_u8_x(svptrue_b8(), m2_sv, qhbits_sv_2);
                        q3bytes_sv = svsub_s8_x(svptrue_b8(), svreinterpret_s8_u8(svand_u8_m(svptrue_b8(), svlsr_n_u8_x(svptrue_b8(), q3bits_sv_1, 4), m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        sumi1_1 = svmla_s32_m(svptrue_b32(), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_2), svdup_n_s32((int32_t)scale[1]));


                        q8bytes_1_sv_1 = svld1_s8(svptrue_b8(), q8_sv); q8_sv += 16;
                        q8bytes_1_sv_2 = svld1_s8(svptrue_b8(), q8_sv); q8_sv += 16;

                        q3h_sv = svlsr_n_u8_x(svptrue_b8(), svbic_u8_x(svptrue_b8(), m3_sv, qhbits_sv_1), 1);
                        q3bytes_sv = svsub_s8_x(svptrue_b8(), svreinterpret_s8_u8(svand_u8_m(svptrue_b8(), svlsr_n_u8_x(svptrue_b8(), q3bits_sv, 6), m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        sumi1_1 = svmla_s32_m(svptrue_b32(), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_1), svdup_n_s32((int32_t)scale[2]));

                        q3h_sv = svlsr_n_u8_x(svptrue_b8(), svbic_u8_x(svptrue_b8(), m3_sv, qhbits_sv_2), 1);
                        q3bytes_sv = svsub_s8_x(svptrue_b8(), svreinterpret_s8_u8(svand_u8_m(svptrue_b8(), svlsr_n_u8_x(svptrue_b8(), q3bits_sv_1, 6), m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        sumi1_1 = svmla_s32_m(svptrue_b32(), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_2), svdup_n_s32((int32_t)scale[3]));

                        if (j == 0) {
                            qhbits_sv_1 = svlsr_n_u8_x(svptrue_b8(), qhbits_sv_1, 4);
                            qhbits_sv_2 = svlsr_n_u8_x(svptrue_b8(), qhbits_sv_2, 4);
                        }

                        scale += 4;
                    }

                    sum += d * (svaddv_s32(svptrue_b32(), sumi1_1));
                } break;
            case 256:
            case 512:
                {
                    svuint8_t qhbits_sv = svld1_u8(svptrue_pat_b8(SV_VL32), qh_sv);
                    svuint8_t q3h_sv;

                    svint32_t sumi1_1 = svdup_n_s32(0);
                    svint8_t q3bytes_sv;

                    for (int j = 0; j < QK_K/128; ++j) {

                        const svuint8_t q3bits_sv = svld1_u8(svptrue_pat_b8(SV_VL32), q3_sv); q3_sv += 32;
                        svint8_t q8bytes_1_sv_1 = svld1_s8(svptrue_pat_b8(SV_VL32), q8_sv); q8_sv += 32;
                        svint8_t q8bytes_1_sv_2 = svld1_s8(svptrue_pat_b8(SV_VL32), q8_sv); q8_sv += 32;

                        q3h_sv = svlsl_n_u8_x(svptrue_pat_b8(SV_VL32), svbic_u8_x(svptrue_pat_b8(SV_VL32), m0_sv, qhbits_sv), 2);
                        q3bytes_sv = svsub_s8_x(svptrue_pat_b8(SV_VL32), svreinterpret_s8_u8(svand_u8_m(svptrue_pat_b8(SV_VL32), q3bits_sv, m3b_sv)), svreinterpret_s8_u8(q3h_sv));


                        svint32_t scale_1 = svsel_s32(svptrue_pat_b32(SV_VL4), svdup_n_s32((int32_t)scale[0]), svdup_n_s32((int32_t)scale[1]));
                        sumi1_1 = svmla_s32_m(svptrue_pat_b32(SV_VL8), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_1), scale_1);

                        q3h_sv = svlsl_n_u8_x(svptrue_pat_b8(SV_VL32), svbic_u8_x(svptrue_pat_b8(SV_VL32), m1_sv, qhbits_sv), 1);
                        q3bytes_sv = svsub_s8_x(svptrue_pat_b8(SV_VL32), svreinterpret_s8_u8(svand_u8_m(svptrue_pat_b8(SV_VL32), svlsr_n_u8_x(svptrue_pat_b8(SV_VL32), q3bits_sv, 2), m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        scale_1 = svsel_s32(svptrue_pat_b32(SV_VL4), svdup_n_s32((int32_t)scale[2]), svdup_n_s32((int32_t)scale[3]));
                        sumi1_1 = svmla_s32_m(svptrue_pat_b32(SV_VL8), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_2), scale_1);

                        scale += 4;
                        q8bytes_1_sv_1 = svld1_s8(svptrue_pat_b8(SV_VL32), q8_sv); q8_sv += 32;
                        q8bytes_1_sv_2 = svld1_s8(svptrue_pat_b8(SV_VL32), q8_sv); q8_sv += 32;

                        q3h_sv = svbic_u8_x(svptrue_pat_b8(SV_VL32), m2_sv, qhbits_sv);
                        q3bytes_sv = svsub_s8_x(svptrue_pat_b8(SV_VL32), svreinterpret_s8_u8(svand_u8_m(svptrue_pat_b8(SV_VL32), svlsr_n_u8_x(svptrue_pat_b8(SV_VL32), q3bits_sv, 4), m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        scale_1 = svsel_s32(svptrue_pat_b32(SV_VL4), svdup_n_s32((int32_t)scale[0]), svdup_n_s32((int32_t)scale[1]));
                        sumi1_1 = svmla_s32_m(svptrue_pat_b32(SV_VL8), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_1), scale_1);

                        q3h_sv = svlsr_n_u8_x(svptrue_pat_b8(SV_VL32), svbic_u8_x(svptrue_pat_b8(SV_VL32), m3_sv, qhbits_sv), 1);
                        q3bytes_sv = svsub_s8_x(svptrue_pat_b8(SV_VL32), svreinterpret_s8_u8(svand_u8_m(svptrue_pat_b8(SV_VL32), svlsr_n_u8_x(svptrue_pat_b8(SV_VL32), q3bits_sv, 6), m3b_sv)), svreinterpret_s8_u8(q3h_sv));

                        scale_1 = svsel_s32(svptrue_pat_b32(SV_VL4), svdup_n_s32((int32_t)scale[2]), svdup_n_s32((int32_t)scale[3]));
                        sumi1_1 = svmla_s32_m(svptrue_pat_b32(SV_VL8), sumi1_1, svdot_s32(vzero_sv, q3bytes_sv, q8bytes_1_sv_2), scale_1);

                        if (j == 0) {
                            qhbits_sv = svlsr_n_u8_x(svptrue_pat_b8(SV_VL32), qhbits_sv, 4);
                        }

                        scale += 4;
                    }

                    sum += d * (svaddv_s32(svptrue_pat_b32(SV_VL8), sumi1_1));
                } break;
            default:
                assert(false && "Unsupported vector length");
                break;
        }
    }
    *s = sum;

#elif __ARM_NEON

    uint32_t aux[3];
    uint32_t utmp[4];

    const uint8x16_t m3b = vdupq_n_u8(0x3);
    const int32x4_t  vzero = vdupq_n_s32(0);

    const uint8x16_t m0 = vdupq_n_u8(1);
    const uint8x16_t m1 = vshlq_n_u8(m0, 1);
    const uint8x16_t m2 = vshlq_n_u8(m0, 2);
    const uint8x16_t m3 = vshlq_n_u8(m0, 3);
    const int8_t m32 = 32;

    ggml_int8x16x4_t q3bytes;

    float sum = 0;

    for (int i = 0; i < nb; ++i) {

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const uint8_t * GGML_RESTRICT qh = x[i].hmask;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        ggml_uint8x16x2_t qhbits = ggml_vld1q_u8_x2(qh);

        ggml_uint8x16x4_t q3h;

        int32_t isum = 0;

        // Set up scales
        memcpy(aux, x[i].scales, 12);
        utmp[3] = ((aux[1] >> 4) & kmask2) | (((aux[2] >> 6) & kmask1) << 4);
        utmp[2] = ((aux[0] >> 4) & kmask2) | (((aux[2] >> 4) & kmask1) << 4);
        utmp[1] = (aux[1] & kmask2) | (((aux[2] >> 2) & kmask1) << 4);
        utmp[0] = (aux[0] & kmask2) | (((aux[2] >> 0) & kmask1) << 4);

        int8_t * scale = (int8_t *)utmp;
        for (int j = 0; j < 16; ++j) scale[j] -= m32;

        for (int j = 0; j < QK_K/128; ++j) {

            const ggml_uint8x16x2_t q3bits = ggml_vld1q_u8_x2(q3); q3 += 32;
            const ggml_int8x16x4_t q8bytes_1 = ggml_vld1q_s8_x4(q8); q8 += 64;
            const ggml_int8x16x4_t q8bytes_2 = ggml_vld1q_s8_x4(q8); q8 += 64;

            q3h.val[0] = vshlq_n_u8(vbicq_u8(m0, qhbits.val[0]), 2);
            q3h.val[1] = vshlq_n_u8(vbicq_u8(m0, qhbits.val[1]), 2);
            q3h.val[2] = vshlq_n_u8(vbicq_u8(m1, qhbits.val[0]), 1);
            q3h.val[3] = vshlq_n_u8(vbicq_u8(m1, qhbits.val[1]), 1);

            q3bytes.val[0] = vsubq_s8(vreinterpretq_s8_u8(vandq_u8(q3bits.val[0], m3b)), vreinterpretq_s8_u8(q3h.val[0]));
            q3bytes.val[1] = vsubq_s8(vreinterpretq_s8_u8(vandq_u8(q3bits.val[1], m3b)), vreinterpretq_s8_u8(q3h.val[1]));
            q3bytes.val[2] = vsubq_s8(vreinterpretq_s8_u8(vandq_u8(vshrq_n_u8(q3bits.val[0], 2), m3b)), vreinterpretq_s8_u8(q3h.val[2]));
            q3bytes.val[3] = vsubq_s8(vreinterpretq_s8_u8(vandq_u8(vshrq_n_u8(q3bits.val[1], 2), m3b)), vreinterpretq_s8_u8(q3h.val[3]));

            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q3bytes.val[0], q8bytes_1.val[0])) * scale[0];
            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q3bytes.val[1], q8bytes_1.val[1])) * scale[1];
            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q3bytes.val[2], q8bytes_1.val[2])) * scale[2];
            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q3bytes.val[3], q8bytes_1.val[3])) * scale[3];

            scale += 4;

            q3h.val[0] = vbicq_u8(m2, qhbits.val[0]);
            q3h.val[1] = vbicq_u8(m2, qhbits.val[1]);
            q3h.val[2] = vshrq_n_u8(vbicq_u8(m3, qhbits.val[0]), 1);
            q3h.val[3] = vshrq_n_u8(vbicq_u8(m3, qhbits.val[1]), 1);

            q3bytes.val[0] = vsubq_s8(vreinterpretq_s8_u8(vandq_u8(vshrq_n_u8(q3bits.val[0], 4), m3b)), vreinterpretq_s8_u8(q3h.val[0]));
            q3bytes.val[1] = vsubq_s8(vreinterpretq_s8_u8(vandq_u8(vshrq_n_u8(q3bits.val[1], 4), m3b)), vreinterpretq_s8_u8(q3h.val[1]));
            q3bytes.val[2] = vsubq_s8(vreinterpretq_s8_u8(vandq_u8(vshrq_n_u8(q3bits.val[0], 6), m3b)), vreinterpretq_s8_u8(q3h.val[2]));
            q3bytes.val[3] = vsubq_s8(vreinterpretq_s8_u8(vandq_u8(vshrq_n_u8(q3bits.val[1], 6), m3b)), vreinterpretq_s8_u8(q3h.val[3]));

            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q3bytes.val[0], q8bytes_2.val[0])) * scale[0];
            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q3bytes.val[1], q8bytes_2.val[1])) * scale[1];
            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q3bytes.val[2], q8bytes_2.val[2])) * scale[2];
            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q3bytes.val[3], q8bytes_2.val[3])) * scale[3];

            scale += 4;

            if (j == 0) {
                qhbits.val[0] = vshrq_n_u8(qhbits.val[0], 4);
                qhbits.val[1] = vshrq_n_u8(qhbits.val[1], 4);
            }

        }
        sum += d * isum;

    }

    *s = sum;

#elif defined __AVX2__

    const __m256i m3 = _mm256_set1_epi8(3);
    const __m256i mone = _mm256_set1_epi8(1);
    const __m128i m32 = _mm_set1_epi8(32);

    __m256 acc = _mm256_setzero_ps();

    uint32_t aux[3];

    for (int i = 0; i < nb; ++i) {

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        // Set up scales
        memcpy(aux, x[i].scales, 12);
        __m128i scales128 = _mm_set_epi32(
                ((aux[1] >> 4) & kmask2) | (((aux[2] >> 6) & kmask1) << 4),
                ((aux[0] >> 4) & kmask2) | (((aux[2] >> 4) & kmask1) << 4),
                (aux[1] & kmask2) | (((aux[2] >> 2) & kmask1) << 4),
                (aux[0] & kmask2) | (((aux[2] >> 0) & kmask1) << 4));
        scales128 = _mm_sub_epi8(scales128, m32);
        const __m256i all_scales = _mm256_cvtepi8_epi16(scales128);
        const __m128i l_scales = _mm256_extracti128_si256(all_scales, 0);
        const __m128i h_scales = _mm256_extracti128_si256(all_scales, 1);
        const __m256i scales[2] = {MM256_SET_M128I(l_scales, l_scales), MM256_SET_M128I(h_scales, h_scales)};

        // high bit
        const __m256i hbits = _mm256_loadu_si256((const __m256i*)x[i].hmask);

        // integer accumulator
        __m256i sumi = _mm256_setzero_si256();

        int bit = 0;
        int is  = 0;

        for (int j = 0; j < QK_K/128; ++j) {
            // load low 2 bits
            const __m256i q3bits = _mm256_loadu_si256((const __m256i*)q3); q3 += 32;

            // prepare low and high bits
            const __m256i q3l_0 = _mm256_and_si256(q3bits, m3);
            const __m256i q3h_0 = _mm256_slli_epi16(_mm256_srli_epi16(_mm256_andnot_si256(hbits, _mm256_slli_epi16(mone, bit)), bit), 2);
            ++bit;

            const __m256i q3l_1 = _mm256_and_si256(_mm256_srli_epi16(q3bits, 2), m3);
            const __m256i q3h_1 = _mm256_slli_epi16(_mm256_srli_epi16(_mm256_andnot_si256(hbits, _mm256_slli_epi16(mone, bit)), bit), 2);
            ++bit;

            const __m256i q3l_2 = _mm256_and_si256(_mm256_srli_epi16(q3bits, 4), m3);
            const __m256i q3h_2 = _mm256_slli_epi16(_mm256_srli_epi16(_mm256_andnot_si256(hbits, _mm256_slli_epi16(mone, bit)), bit), 2);
            ++bit;

            const __m256i q3l_3 = _mm256_and_si256(_mm256_srli_epi16(q3bits, 6), m3);
            const __m256i q3h_3 = _mm256_slli_epi16(_mm256_srli_epi16(_mm256_andnot_si256(hbits, _mm256_slli_epi16(mone, bit)), bit), 2);
            ++bit;

            // load Q8 quants
            const __m256i q8_0 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;
            const __m256i q8_1 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;
            const __m256i q8_2 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;
            const __m256i q8_3 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;

            // Dot product: we multiply the 2 low bits and 1 high bit part separately, so we can use _mm256_maddubs_epi16,
            // and then subtract. The high bit part has the 2 already subtracted (and so, it is zero if the high bit was not set,
            // and 2 if the high bit was set)
            __m256i q8s_0 = _mm256_maddubs_epi16(q3h_0, q8_0);
            __m256i q8s_1 = _mm256_maddubs_epi16(q3h_1, q8_1);
            __m256i q8s_2 = _mm256_maddubs_epi16(q3h_2, q8_2);
            __m256i q8s_3 = _mm256_maddubs_epi16(q3h_3, q8_3);

            __m256i p16_0 = _mm256_maddubs_epi16(q3l_0, q8_0);
            __m256i p16_1 = _mm256_maddubs_epi16(q3l_1, q8_1);
            __m256i p16_2 = _mm256_maddubs_epi16(q3l_2, q8_2);
            __m256i p16_3 = _mm256_maddubs_epi16(q3l_3, q8_3);

            p16_0 = _mm256_sub_epi16(p16_0, q8s_0);
            p16_1 = _mm256_sub_epi16(p16_1, q8s_1);
            p16_2 = _mm256_sub_epi16(p16_2, q8s_2);
            p16_3 = _mm256_sub_epi16(p16_3, q8s_3);

            // multiply with scales
            p16_0 = _mm256_madd_epi16(_mm256_shuffle_epi8(scales[j], get_scale_shuffle_q3k(is + 0)), p16_0);
            p16_1 = _mm256_madd_epi16(_mm256_shuffle_epi8(scales[j], get_scale_shuffle_q3k(is + 1)), p16_1);
            p16_2 = _mm256_madd_epi16(_mm256_shuffle_epi8(scales[j], get_scale_shuffle_q3k(is + 2)), p16_2);
            p16_3 = _mm256_madd_epi16(_mm256_shuffle_epi8(scales[j], get_scale_shuffle_q3k(is + 3)), p16_3);

            // accumulate
            p16_0 = _mm256_add_epi32(p16_0, p16_1);
            p16_2 = _mm256_add_epi32(p16_2, p16_3);
            sumi  = _mm256_add_epi32(sumi, _mm256_add_epi32(p16_0, p16_2));

        }

        // multiply with block scale and accumulate
        acc = _mm256_fmadd_ps(_mm256_broadcast_ss(&d), _mm256_cvtepi32_ps(sumi), acc);

    }

    *s = hsum_float_8(acc);

#elif defined __AVX__

    const __m128i m3 = _mm_set1_epi8(3);
    const __m128i mone = _mm_set1_epi8(1);
    const __m128i m32 = _mm_set1_epi8(32);
    const __m128i m2 = _mm_set1_epi8(2);

    __m256 acc = _mm256_setzero_ps();

    const uint32_t *aux;

    for (int i = 0; i < nb; ++i) {

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        // Set up scales
        aux = (const uint32_t *)x[i].scales;
        __m128i scales128 = _mm_set_epi32(
                ((aux[1] >> 4) & kmask2) | (((aux[2] >> 6) & kmask1) << 4),
                ((aux[0] >> 4) & kmask2) | (((aux[2] >> 4) & kmask1) << 4),
                (aux[1] & kmask2) | (((aux[2] >> 2) & kmask1) << 4),
                (aux[0] & kmask2) | (((aux[2] >> 0) & kmask1) << 4));
        scales128 = _mm_sub_epi8(scales128, m32);
        const __m128i scales_0 = _mm_cvtepi8_epi16(scales128);
        const __m128i scales_1 = _mm_cvtepi8_epi16(_mm_unpackhi_epi64(scales128, scales128));
        const __m128i scales[2] = { scales_0, scales_1 };

        // high bit *128*2 from block_q3_K.hmask[QK_K/8]
        const __m128i hbits_0 = _mm_loadu_si128((const __m128i*)&x[i].hmask[0]);
        const __m128i hbits_1 = _mm_loadu_si128((const __m128i*)&x[i].hmask[16]);

        // integer accumulator
        __m128i sumi_0 = _mm_setzero_si128();
        __m128i sumi_1 = _mm_setzero_si128();

        for (int j = 0; j < QK_K/128; ++j) {
            // load low 2 bits *64*2 from block_q3_K.qs[QK_K/4]
            const __m128i q3bits_0 = _mm_loadu_si128((const __m128i*)q3); q3 += 16;
            const __m128i q3bits_1 = _mm_loadu_si128((const __m128i*)q3); q3 += 16;

            // prepare low and high bits
            const int bit = j << 2;

            const __m128i q3l_0 = _mm_and_si128(q3bits_0, m3);
            const __m128i q3l_1 = _mm_and_si128(q3bits_1, m3);
            const __m128i q3h_0 = _mm_slli_epi16(_mm_srli_epi16(_mm_andnot_si128(hbits_0, _mm_slli_epi16(mone, bit)), bit), 2);
            const __m128i q3h_1 = _mm_slli_epi16(_mm_srli_epi16(_mm_andnot_si128(hbits_1, _mm_slli_epi16(mone, bit)), bit), 2);

            const __m128i q3l_2 = _mm_and_si128(_mm_srli_epi16(q3bits_0, 2), m3);
            const __m128i q3l_3 = _mm_and_si128(_mm_srli_epi16(q3bits_1, 2), m3);
            const __m128i q3h_2 = _mm_slli_epi16(_mm_srli_epi16(_mm_andnot_si128(hbits_0, _mm_slli_epi16(mone, bit+1)), bit+1), 2);
            const __m128i q3h_3 = _mm_slli_epi16(_mm_srli_epi16(_mm_andnot_si128(hbits_1, _mm_slli_epi16(mone, bit+1)), bit+1), 2);

            const __m128i q3l_4 = _mm_and_si128(_mm_srli_epi16(q3bits_0, 4), m3);
            const __m128i q3l_5 = _mm_and_si128(_mm_srli_epi16(q3bits_1, 4), m3);
            const __m128i q3h_4 = _mm_slli_epi16(_mm_srli_epi16(_mm_andnot_si128(hbits_0, _mm_slli_epi16(mone, bit+2)), bit+2), 2);
            const __m128i q3h_5 = _mm_slli_epi16(_mm_srli_epi16(_mm_andnot_si128(hbits_1, _mm_slli_epi16(mone, bit+2)), bit+2), 2);

            const __m128i q3l_6 = _mm_and_si128(_mm_srli_epi16(q3bits_0, 6), m3);
            const __m128i q3l_7 = _mm_and_si128(_mm_srli_epi16(q3bits_1, 6), m3);
            const __m128i q3h_6 = _mm_slli_epi16(_mm_srli_epi16(_mm_andnot_si128(hbits_0, _mm_slli_epi16(mone, bit+3)), bit+3), 2);
            const __m128i q3h_7 = _mm_slli_epi16(_mm_srli_epi16(_mm_andnot_si128(hbits_1, _mm_slli_epi16(mone, bit+3)), bit+3), 2);

            // load Q8 quants from block_q8_K.qs[QK_K]
            const __m128i q8_0 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_1 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_2 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_3 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_4 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_5 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_6 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_7 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;

            // Dot product: we multiply the 2 low bits and 1 high bit part separately, so we can use _mm256_maddubs_epi16,
            // and then subtract. The high bit part has the 2 already subtracted (and so, it is zero if the high bit was not set,
            // and 2 if the high bit was set)
            __m128i q8s_0 = _mm_maddubs_epi16(q3h_0, q8_0);
            __m128i q8s_1 = _mm_maddubs_epi16(q3h_1, q8_1);
            __m128i q8s_2 = _mm_maddubs_epi16(q3h_2, q8_2);
            __m128i q8s_3 = _mm_maddubs_epi16(q3h_3, q8_3);
            __m128i q8s_4 = _mm_maddubs_epi16(q3h_4, q8_4);
            __m128i q8s_5 = _mm_maddubs_epi16(q3h_5, q8_5);
            __m128i q8s_6 = _mm_maddubs_epi16(q3h_6, q8_6);
            __m128i q8s_7 = _mm_maddubs_epi16(q3h_7, q8_7);

            __m128i p16_0 = _mm_maddubs_epi16(q3l_0, q8_0);
            __m128i p16_1 = _mm_maddubs_epi16(q3l_1, q8_1);
            __m128i p16_2 = _mm_maddubs_epi16(q3l_2, q8_2);
            __m128i p16_3 = _mm_maddubs_epi16(q3l_3, q8_3);
            __m128i p16_4 = _mm_maddubs_epi16(q3l_4, q8_4);
            __m128i p16_5 = _mm_maddubs_epi16(q3l_5, q8_5);
            __m128i p16_6 = _mm_maddubs_epi16(q3l_6, q8_6);
            __m128i p16_7 = _mm_maddubs_epi16(q3l_7, q8_7);

            p16_0 = _mm_sub_epi16(p16_0, q8s_0);
            p16_1 = _mm_sub_epi16(p16_1, q8s_1);
            p16_2 = _mm_sub_epi16(p16_2, q8s_2);
            p16_3 = _mm_sub_epi16(p16_3, q8s_3);
            p16_4 = _mm_sub_epi16(p16_4, q8s_4);
            p16_5 = _mm_sub_epi16(p16_5, q8s_5);
            p16_6 = _mm_sub_epi16(p16_6, q8s_6);
            p16_7 = _mm_sub_epi16(p16_7, q8s_7);

            // multiply with scales
            __m128i shuffle = _mm_set1_epi16(0x0100);
            p16_0 = _mm_madd_epi16(_mm_shuffle_epi8(scales[j], shuffle), p16_0);
            shuffle = _mm_add_epi16(shuffle, m2);
            p16_1 = _mm_madd_epi16(_mm_shuffle_epi8(scales[j], shuffle), p16_1);
            shuffle = _mm_add_epi16(shuffle, m2);
            p16_2 = _mm_madd_epi16(_mm_shuffle_epi8(scales[j], shuffle), p16_2);
            shuffle = _mm_add_epi16(shuffle, m2);
            p16_3 = _mm_madd_epi16(_mm_shuffle_epi8(scales[j], shuffle), p16_3);
            shuffle = _mm_add_epi16(shuffle, m2);
            p16_4 = _mm_madd_epi16(_mm_shuffle_epi8(scales[j], shuffle), p16_4);
            shuffle = _mm_add_epi16(shuffle, m2);
            p16_5 = _mm_madd_epi16(_mm_shuffle_epi8(scales[j], shuffle), p16_5);
            shuffle = _mm_add_epi16(shuffle, m2);
            p16_6 = _mm_madd_epi16(_mm_shuffle_epi8(scales[j], shuffle), p16_6);
            shuffle = _mm_add_epi16(shuffle, m2);
            p16_7 = _mm_madd_epi16(_mm_shuffle_epi8(scales[j], shuffle), p16_7);

            // accumulate
            p16_0 = _mm_add_epi32(p16_0, p16_1);
            p16_2 = _mm_add_epi32(p16_2, p16_3);
            p16_4 = _mm_add_epi32(p16_4, p16_5);
            p16_6 = _mm_add_epi32(p16_6, p16_7);
            sumi_0 = _mm_add_epi32(sumi_0, _mm_add_epi32(p16_0, p16_2));
            sumi_1 = _mm_add_epi32(sumi_1, _mm_add_epi32(p16_4, p16_6));

        }

        // multiply with block scale and accumulate
        __m256i sumi = MM256_SET_M128I(sumi_1, sumi_0);
        acc = _mm256_add_ps(_mm256_mul_ps(_mm256_broadcast_ss(&d), _mm256_cvtepi32_ps(sumi)), acc);

    }

    *s = hsum_float_8(acc);

#elif defined __wasm_simd128__
    int8_t  aux8[QK_K];
    float   sums[8] = {0};
    uint32_t auxs[4];

    float sumf = 0;
    for (int i = 0; i < nb; ++i) {
        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const uint8_t * GGML_RESTRICT hm = x[i].hmask;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        // Process blocks with SIMD
        int8_t * a = aux8;
        uint8_t m = 1;
        for (int j = 0; j < QK_K; j += 128) {
            for (int shift = 0; shift <= 6; shift += 2) {
                v128_t v_m = wasm_i8x16_splat(m);
                for (int l = 0; l < 32; l += 16) {
                    v128_t v_q3 = wasm_v128_load(q3 + l);
                    v128_t v_shift = wasm_i8x16_shr(v_q3, shift);
                    v128_t v_low2 = wasm_v128_and(v_shift, wasm_i8x16_splat(0x03));

                    v128_t v_hm = wasm_v128_load(hm + l);
                    v128_t v_mask = wasm_v128_and(v_hm, v_m);
                    v_mask = wasm_i8x16_ne(v_mask, wasm_i8x16_splat(0));

                    v_low2 = wasm_i8x16_sub(v_low2, wasm_v128_and(wasm_i8x16_splat(4), wasm_v128_not(v_mask)));
                    wasm_v128_store(a + l, v_low2);
                }
                a += 32;
                m <<= 1;
            }
            q3 += 32;
        }

        // Extract scales
        memcpy(auxs, x[i].scales, 12);
        uint32_t tmp = auxs[2];
        auxs[2] = ((auxs[0] >> 4) & kmask2) | (((tmp >> 4) & kmask1) << 4);
        auxs[3] = ((auxs[1] >> 4) & kmask2) | (((tmp >> 6) & kmask1) << 4);
        auxs[0] = (auxs[0] & kmask2) | (((tmp >> 0) & kmask1) << 4);
        auxs[1] = (auxs[1] & kmask2) | (((tmp >> 2) & kmask1) << 4);
        const int8_t * scales = (const int8_t *)auxs;

        // SIMD dot product with register accumulators
        v128_t v_acc0 = wasm_i32x4_splat(0);
        v128_t v_acc1 = wasm_i32x4_splat(0);
        a = aux8;
        for (int j = 0; j < QK_K/16; ++j) {
            const v128_t v_scale = wasm_i16x8_splat(scales[j] - 32);

            // Process 16 elements per iteration
            for (int k = 0; k < 2; ++k) {
                const v128_t v_q8 = wasm_i16x8_load8x8(q8);
                const v128_t v_a = wasm_i16x8_load8x8(a);

                v128_t v_prod = wasm_i16x8_mul(v_q8, v_a);
                v_prod = wasm_i16x8_mul(v_prod, v_scale);

                v_acc0 = wasm_i32x4_add(v_acc0, wasm_i32x4_extend_low_i16x8(v_prod));
                v_acc1 = wasm_i32x4_add(v_acc1, wasm_i32x4_extend_high_i16x8(v_prod));

                q8 += 8;
                a += 8;
            }
        }

        // Accumulate results
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const v128_t v_d = wasm_f32x4_splat(d);
        v128_t v_sum = wasm_f32x4_add(
            wasm_f32x4_mul(wasm_f32x4_convert_i32x4(v_acc0), v_d),
            wasm_f32x4_mul(wasm_f32x4_convert_i32x4(v_acc1), v_d)
        );

        // Accumulate into sums vector
        wasm_v128_store(sums, wasm_f32x4_add(wasm_v128_load(sums), v_sum));
    }

    // Horizontal sum
    v128_t v_sum = wasm_f32x4_add(wasm_v128_load(sums), wasm_v128_load(sums + 4));
    sumf = wasm_f32x4_extract_lane(v_sum, 0) +
           wasm_f32x4_extract_lane(v_sum, 1) +
           wasm_f32x4_extract_lane(v_sum, 2) +
           wasm_f32x4_extract_lane(v_sum, 3);

    *s = sumf;

#elif defined __riscv_v_intrinsic

    uint32_t aux[3];
    uint32_t utmp[4];

    const int vector_length = __riscv_vlenb() * 8;
    float sumf = 0;

    switch (vector_length) {
    case 256:
        for (int i = 0; i < nb; ++i) {

            const uint8_t * GGML_RESTRICT q3 = x[i].qs;
            const uint8_t * GGML_RESTRICT qh = x[i].hmask;
            const  int8_t * GGML_RESTRICT q8 = y[i].qs;

            memcpy(aux, x[i].scales, 12);
            utmp[3] = ((aux[1] >> 4) & kmask2) | (((aux[2] >> 6) & kmask1) << 4);
            utmp[2] = ((aux[0] >> 4) & kmask2) | (((aux[2] >> 4) & kmask1) << 4);
            utmp[1] = (aux[1] & kmask2) | (((aux[2] >> 2) & kmask1) << 4);
            utmp[0] = (aux[0] & kmask2) | (((aux[2] >> 0) & kmask1) << 4);

            int8_t * scale = (int8_t *)utmp;
            for (int j = 0; j < 16; ++j) scale[j] -= 32;


            size_t vl = 32;
            uint8_t m =  1;

            vint32m1_t vzero = __riscv_vmv_v_x_i32m1(0, 1);
            vuint8m1_t vqh = __riscv_vle8_v_u8m1(qh, vl);

            int sum_t = 0;

            for (int j = 0; j < QK_K; j += 128) {

                vl = 32;

                // load Q3
                vuint8m1_t q3_x = __riscv_vle8_v_u8m1(q3, vl);

                vint8m1_t q3_0 = __riscv_vreinterpret_v_u8m1_i8m1(__riscv_vand_vx_u8m1(q3_x, 0x03, vl));
                vint8m1_t q3_1 = __riscv_vreinterpret_v_u8m1_i8m1(__riscv_vand_vx_u8m1(__riscv_vsrl_vx_u8m1(q3_x, 0x2, vl), 0x03 , vl));
                vint8m1_t q3_2 = __riscv_vreinterpret_v_u8m1_i8m1(__riscv_vand_vx_u8m1(__riscv_vsrl_vx_u8m1(q3_x, 0x4, vl), 0x03 , vl));
                vint8m1_t q3_3 = __riscv_vreinterpret_v_u8m1_i8m1(__riscv_vand_vx_u8m1(__riscv_vsrl_vx_u8m1(q3_x, 0x6, vl), 0x03 , vl));

                // compute mask for subtraction
                vuint8m1_t qh_m0 = __riscv_vand_vx_u8m1(vqh, m, vl);
                vbool8_t vmask_0 = __riscv_vmseq_vx_u8m1_b8(qh_m0, 0, vl);
                vint8m1_t q3_m0 = __riscv_vsub_vx_i8m1_mu(vmask_0, q3_0, q3_0, 0x4, vl);
                m <<= 1;

                vuint8m1_t qh_m1 = __riscv_vand_vx_u8m1(vqh, m, vl);
                vbool8_t vmask_1 = __riscv_vmseq_vx_u8m1_b8(qh_m1, 0, vl);
                vint8m1_t q3_m1 = __riscv_vsub_vx_i8m1_mu(vmask_1, q3_1, q3_1, 0x4, vl);
                m <<= 1;

                vuint8m1_t qh_m2 = __riscv_vand_vx_u8m1(vqh, m, vl);
                vbool8_t vmask_2 = __riscv_vmseq_vx_u8m1_b8(qh_m2, 0, vl);
                vint8m1_t q3_m2 = __riscv_vsub_vx_i8m1_mu(vmask_2, q3_2, q3_2, 0x4, vl);
                m <<= 1;

                vuint8m1_t qh_m3 = __riscv_vand_vx_u8m1(vqh, m, vl);
                vbool8_t vmask_3 = __riscv_vmseq_vx_u8m1_b8(qh_m3, 0, vl);
                vint8m1_t q3_m3 = __riscv_vsub_vx_i8m1_mu(vmask_3, q3_3, q3_3, 0x4, vl);
                m <<= 1;

                // load Q8 and take product with Q3
                vint16m2_t a0 = __riscv_vwmul_vv_i16m2(q3_m0, __riscv_vle8_v_i8m1(q8, vl), vl);
                vint16m2_t a1 = __riscv_vwmul_vv_i16m2(q3_m1, __riscv_vle8_v_i8m1(q8+32, vl), vl);
                vint16m2_t a2 = __riscv_vwmul_vv_i16m2(q3_m2, __riscv_vle8_v_i8m1(q8+64, vl), vl);
                vint16m2_t a3 = __riscv_vwmul_vv_i16m2(q3_m3, __riscv_vle8_v_i8m1(q8+96, vl), vl);

                vl = 16;

                // retrieve lane to multiply with scale
                vint32m2_t aux0_0 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(a0, 0), (scale[0]), vl);
                vint32m2_t aux0_1 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(a0, 1), (scale[1]), vl);
                vint32m2_t aux1_0 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(a1, 0), (scale[2]), vl);
                vint32m2_t aux1_1 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(a1, 1), (scale[3]), vl);
                vint32m2_t aux2_0 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(a2, 0), (scale[4]), vl);
                vint32m2_t aux2_1 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(a2, 1), (scale[5]), vl);
                vint32m2_t aux3_0 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(a3, 0), (scale[6]), vl);
                vint32m2_t aux3_1 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(a3, 1), (scale[7]), vl);

                vint32m1_t isum0 = __riscv_vredsum_vs_i32m2_i32m1(__riscv_vadd_vv_i32m2(aux0_0, aux0_1, vl), vzero, vl);
                vint32m1_t isum1 = __riscv_vredsum_vs_i32m2_i32m1(__riscv_vadd_vv_i32m2(aux1_0, aux1_1, vl), isum0, vl);
                vint32m1_t isum2 = __riscv_vredsum_vs_i32m2_i32m1(__riscv_vadd_vv_i32m2(aux2_0, aux2_1, vl), isum1, vl);
                vint32m1_t isum3 = __riscv_vredsum_vs_i32m2_i32m1(__riscv_vadd_vv_i32m2(aux3_0, aux3_1, vl), isum2, vl);

                sum_t +=  __riscv_vmv_x_s_i32m1_i32(isum3);

                q3 += 32;    q8 += 128;   scale += 8;

            }

            const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;

            sumf += d*sum_t;

        }
        break;
    case 128:
        for (int i = 0; i < nb; ++i) {
            const uint8_t * restrict q3 = x[i].qs;
            const uint8_t * restrict qh = x[i].hmask;
            const  int8_t * restrict q8 = y[i].qs;

            int8_t * scale = (int8_t *)utmp;
            int tmp;
            __asm__ __volatile__(
                "vsetivli zero, 12, e8, m1\n\t"
                "vle8.v v0, (%[s6b])\n\t"
                "vmv1r.v v2, v0\n\t"
                "vsetivli zero, 2, e64, m1\n\t"
                "vmv.v.x v9, %[sh]\n\t"\
                "vslidedown.vi v1, v0, 1\n\t"
                "vslide1up.vx v8, v9, zero\n\t" // {0, 0, 4, 4}
                "vslideup.vi v0, v2, 1\n\t" // {aux[0], aux[1], aux[0], aux[1]}
                "vsetivli zero, 4, e32, m1\n\t"
                "vid.v v9\n\t"
                "vmv.x.s %[tmp], v1\n\t"
                "vsll.vi v9, v9, 1\n\t" // {0, 2, 4, 6}
                "vmv.v.x v1, %[tmp]\n\t" // {aux[2], aux[2], aux[2], aux[2]}
                "vsrl.vv v4, v1, v9\n\t"
                "vsrl.vv v2, v0, v8\n\t"
                "vand.vx v5, v4, %[kmask1]\n\t"
                "vand.vx v3, v2, %[kmask2]\n\t"
                "vsll.vi v6, v5, 4\n\t"
                "vor.vv v7, v6, v3\n\t"
                "vsetivli zero, 16, e8, m1\n\t"
                "vsub.vx v0, v7, %[c]\n\t"
                "vse8.v v0, (%[scale])"
                : [tmp] "=&r" (tmp)
                : [sh] "r" (0x0000000400000004), [s6b] "r" (x[i].scales), [c] "r" (32)
                , [scale] "r" (scale), [kmask1] "r" (kmask1), [kmask2] "r" (kmask2)
                : "memory"
                , "v0", "v1", "v2", "v3", "v4", "v5", "v6", "v7"
                , "v8", "v9", "v10", "v11", "v12", "v13", "v14", "v15"
                , "v16", "v17", "v18", "v19", "v20", "v21", "v22", "v23"
                , "v24", "v25", "v26", "v27", "v28", "v29", "v30", "v31"
            );

            uint8_t m = 1;
            int isum = 0;
            for (int j = 0; j < QK_K; j += 128) {
                __asm__ __volatile__(
                    "vsetvli zero, %[vl32], e8, m2, ta, mu\n\t"
                    "vle8.v v8, (%[q3])\n\t"
                    "vsrl.vi v10, v8, 2\n\t"
                    "vsrl.vi v12, v8, 4\n\t"
                    "vsrl.vi v14, v8, 6\n\t"
                    "vand.vi v8, v8, 3\n\t"
                    "vand.vi v10, v10, 3\n\t"
                    "vand.vi v12, v12, 3\n\t"
                    "vle8.v v2, (%[qh])\n\t"
                    "vand.vx v4, v2, %[m]\n\t"
                    "slli %[m], %[m], 1\n\t"
                    "vmseq.vx v0, v4, zero\n\t"
                    "vadd.vi v8, v8, -4, v0.t\n\t"
                    "vand.vx v4, v2, %[m]\n\t"
                    "slli %[m], %[m], 1\n\t"
                    "vmseq.vx v0, v4, zero\n\t"
                    "vadd.vi v10, v10, -4, v0.t\n\t"
                    "vand.vx v4, v2, %[m]\n\t"
                    "slli %[m], %[m], 1\n\t"
                    "vmseq.vx v0, v4, zero\n\t"
                    "vadd.vi v12, v12, -4, v0.t\n\t"
                    "vand.vx v4, v2, %[m]\n\t"
                    "slli %[m], %[m], 1\n\t"
                    "vmseq.vx v0, v4, zero\n\t"
                    "vadd.vi v14, v14, -4, v0.t\n\t"
                    "vsetvli zero, %[vl128], e8, m8\n\t"
                    "vle8.v v0, (%[q8])\n\t"
                    "vsetvli zero, %[vl64], e8, m4\n\t"
                    "vwmul.vv v16, v0, v8\n\t"
                    "vwmul.vv v24, v4, v12\n\t"
                    "vsetivli zero, 16, e16, m2\n\t"
                    "vmv.v.x v0, zero\n\t"
                    "vwredsum.vs v10, v16, v0\n\t"
                    "vwredsum.vs v9, v18, v0\n\t"
                    "vwredsum.vs v8, v20, v0\n\t"
                    "vwredsum.vs v7, v22, v0\n\t"
                    "vwredsum.vs v11, v24, v0\n\t"
                    "vwredsum.vs v12, v26, v0\n\t"
                    "vwredsum.vs v13, v28, v0\n\t"
                    "vwredsum.vs v14, v30, v0\n\t"
                    "vsetivli zero, 4, e32, m1\n\t"
                    "vslideup.vi v10, v9, 1\n\t"
                    "vslideup.vi v8, v7, 1\n\t"
                    "vslideup.vi v11, v12, 1\n\t"
                    "vslideup.vi v13, v14, 1\n\t"
                    "vslideup.vi v10, v8, 2\n\t"
                    "vslideup.vi v11, v13, 2\n\t"
                    "vsetivli zero, 8, e32, m2\n\t"\
                    "vle8.v v15, (%[scale])\n\t"
                    "vsext.vf4 v12, v15\n\t"
                    "vmul.vv v10, v10, v12\n\t"
                    "vredsum.vs v0, v10, v0\n\t"
                    "vmv.x.s %[tmp], v0\n\t"
                    "add %[isum], %[isum], %[tmp]"
                    : [tmp] "=&r" (tmp), [m] "+&r" (m), [isum] "+&r" (isum)
                    : [vl128] "r" (128), [vl64] "r" (64), [vl32] "r" (32)
                    , [q3] "r" (q3), [qh] "r" (qh), [scale] "r" (scale), [q8] "r" (q8)
                    : "memory"
                    , "v0", "v1", "v2", "v3", "v4", "v5", "v6", "v7"
                    , "v8", "v9", "v10", "v11", "v12", "v13", "v14", "v15"
                    , "v16", "v17", "v18", "v19", "v20", "v21", "v22", "v23"
                    , "v24", "v25", "v26", "v27", "v28", "v29", "v30", "v31"
                );
                q3 += 32;    q8 += 128;   scale += 8;
            }

            const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
            sumf += d * isum;
        }
        break;
    default:
        assert(false && "Unsupported vector length");
        break;
    }

    *s = sumf;

#elif defined(__POWER9_VECTOR__)
    const vector signed char lowMask = vec_splats((signed char)0x3);
    const vector signed char lowMask1 = vec_splats((int8_t)0xf);
    const vector signed char lowMask2 = vec_splats((int8_t)0x30);
    const vector int v0 = vec_splats((int32_t)0);
    const vector signed char v1 = vec_splats((signed char)0x1);
    const vector unsigned char v2 = vec_splats((unsigned char)0x2);
    const vector unsigned char v3 = vec_splats((unsigned char)0x3);
    const vector unsigned char v4 = vec_splats((unsigned char)0x4);
    const vector unsigned char v6 = vec_splats((unsigned char)0x6);
    const vector signed char off = vec_splats((signed char)0x20);

    vector float vsumf0 = vec_splats(0.0f);
    vector float vsumf1 = vec_splats(0.0f);
    vector float vsumf2 = vec_splats(0.0f);
    vector float vsumf3 = vec_splats(0.0f);

    for (int i = 0; i < nb; ++i) {
        vector float vxd = vec_splats(GGML_FP16_TO_FP32(x[i].d));
        vector float vyd = vec_splats(y[i].d);
        vector float vd = vec_mul(vxd, vyd);

        UNUSED(kmask1);
        UNUSED(kmask2);

        vector signed char u0 = (vector signed char)vec_xl_len(x[i].scales, 8);
        vector signed char u1 = vec_and(u0, lowMask1);
        vector signed char u2 = (vector signed char)vec_xl_len(x[i].scales + 8, 4);
        vector signed char u3 = (vector signed char)vec_mergeh((vector signed int)u2, (vector signed int)vec_sr(u2, v2));
        vector signed char u30 = vec_sl(vec_and(u3, lowMask), v4);
        vector signed char u31 = vec_and(u3, lowMask2);

        u1 = vec_or(u1, u30);
        u2 = vec_or(vec_sr(u0, v4), u31);

        vector signed char vscales = (vector signed char)vec_mergeh((vector signed long long)u1, (vector signed long long)u2);
        vector signed char qxhs0 = (vector signed char)vec_xl( 0, x[i].hmask);
        vector signed char qxhs1 = (vector signed char)vec_xl(16, x[i].hmask);

        vscales = vec_sub(vscales, off);

        vector signed int vsumi0 = v0;
        vector signed int vsumi1 = v0;
        vector signed int vsumi2 = v0;
        vector signed int vsumi3 = v0;
        vector signed int vsumi4 = v0;
        vector signed int vsumi5 = v0;
        vector signed int vsumi6 = v0;
        vector signed int vsumi7 = v0;

        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        for (int j = 0; j < QK_K/128; ++j) {
            __builtin_prefetch(q3, 0, 1);
            __builtin_prefetch(q8, 0, 1);

            vector signed char qxs0 = (vector signed char)vec_xl( 0, q3);
            vector signed char qxs1 = (vector signed char)vec_xl(16, q3);
            q3 += 32;

            //the low 2 bits
            vector signed char qxs00 = vec_and(qxs0, lowMask);
            vector signed char qxs01 = vec_and(vec_sr(qxs0, v2), lowMask);
            vector signed char qxs02 = vec_and(vec_sr(qxs0, v4), lowMask);
            vector signed char qxs03 = vec_and(vec_sr(qxs0, v6), lowMask);
            vector signed char qxs10 = vec_and(qxs1, lowMask);
            vector signed char qxs11 = vec_and(vec_sr(qxs1, v2), lowMask);
            vector signed char qxs12 = vec_and(vec_sr(qxs1, v4), lowMask);
            vector signed char qxs13 = vec_and(vec_sr(qxs1, v6), lowMask);

            //the 3rd bit
            vector signed char qxh00 = vec_sl(vec_andc(v1, qxhs0), v2);
            vector signed char qxh01 = vec_sl(vec_andc(v1, vec_sr(qxhs0, (vector unsigned char)v1)), v2);
            vector signed char qxh02 = vec_sl(vec_andc(v1, vec_sr(qxhs0, v2)), v2);
            vector signed char qxh03 = vec_sl(vec_andc(v1, vec_sr(qxhs0, v3)), v2);
            vector signed char qxh10 = vec_sl(vec_andc(v1, qxhs1), v2);
            vector signed char qxh11 = vec_sl(vec_andc(v1, vec_sr(qxhs1, (vector unsigned char)v1)), v2);
            vector signed char qxh12 = vec_sl(vec_andc(v1, vec_sr(qxhs1, v2)), v2);
            vector signed char qxh13 = vec_sl(vec_andc(v1, vec_sr(qxhs1, v3)), v2);
            qxhs0 = vec_sr(qxhs0, v4);
            qxhs1 = vec_sr(qxhs1, v4);

            vector signed char q3x00 = vec_sub(qxs00, qxh00);
            vector signed char q3x01 = vec_sub(qxs01, qxh01);
            vector signed char q3x02 = vec_sub(qxs02, qxh02);
            vector signed char q3x03 = vec_sub(qxs03, qxh03);
            vector signed char q3x10 = vec_sub(qxs10, qxh10);
            vector signed char q3x11 = vec_sub(qxs11, qxh11);
            vector signed char q3x12 = vec_sub(qxs12, qxh12);
            vector signed char q3x13 = vec_sub(qxs13, qxh13);

            vector signed char q8y00 = vec_xl(  0, q8);
            vector signed char q8y10 = vec_xl( 16, q8);
            vector signed char q8y01 = vec_xl( 32, q8);
            vector signed char q8y11 = vec_xl( 48, q8);
            vector signed char q8y02 = vec_xl( 64, q8);
            vector signed char q8y12 = vec_xl( 80, q8);
            vector signed char q8y03 = vec_xl( 96, q8);
            vector signed char q8y13 = vec_xl(112, q8);
            q8 += 128;

            vector signed short vscales_h = vec_unpackh(vscales);
            vector signed short vs0 = vec_splat(vscales_h, 0);
            vector signed short vs1 = vec_splat(vscales_h, 1);
            vector signed short vs2 = vec_splat(vscales_h, 2);
            vector signed short vs3 = vec_splat(vscales_h, 3);
            vector signed short vs4 = vec_splat(vscales_h, 4);
            vector signed short vs5 = vec_splat(vscales_h, 5);
            vector signed short vs6 = vec_splat(vscales_h, 6);
            vector signed short vs7 = vec_splat(vscales_h, 7);
            vscales = vec_sld(vscales, vscales, 8);

            vector signed short qv00 = vec_add(vec_mule(q3x00, q8y00), vec_mulo(q3x00, q8y00));
            vector signed short qv01 = vec_add(vec_mule(q3x01, q8y01), vec_mulo(q3x01, q8y01));
            vector signed short qv02 = vec_add(vec_mule(q3x02, q8y02), vec_mulo(q3x02, q8y02));
            vector signed short qv03 = vec_add(vec_mule(q3x03, q8y03), vec_mulo(q3x03, q8y03));
            vector signed short qv10 = vec_add(vec_mule(q3x10, q8y10), vec_mulo(q3x10, q8y10));
            vector signed short qv11 = vec_add(vec_mule(q3x11, q8y11), vec_mulo(q3x11, q8y11));
            vector signed short qv12 = vec_add(vec_mule(q3x12, q8y12), vec_mulo(q3x12, q8y12));
            vector signed short qv13 = vec_add(vec_mule(q3x13, q8y13), vec_mulo(q3x13, q8y13));

            vsumi0 = vec_msum(qv00, vs0, vsumi0);
            vsumi1 = vec_msum(qv01, vs2, vsumi1);
            vsumi2 = vec_msum(qv02, vs4, vsumi2);
            vsumi3 = vec_msum(qv03, vs6, vsumi3);
            vsumi4 = vec_msum(qv10, vs1, vsumi4);
            vsumi5 = vec_msum(qv11, vs3, vsumi5);
            vsumi6 = vec_msum(qv12, vs5, vsumi6);
            vsumi7 = vec_msum(qv13, vs7, vsumi7);
        }

        vsumi0 = vec_add(vsumi0, vsumi4);
        vsumi1 = vec_add(vsumi1, vsumi5);
        vsumi2 = vec_add(vsumi2, vsumi6);
        vsumi3 = vec_add(vsumi3, vsumi7);

        vsumf0 = vec_madd(vec_ctf(vsumi0, 0), vd, vsumf0);
        vsumf1 = vec_madd(vec_ctf(vsumi1, 0), vd, vsumf1);
        vsumf2 = vec_madd(vec_ctf(vsumi2, 0), vd, vsumf2);
        vsumf3 = vec_madd(vec_ctf(vsumi3, 0), vd, vsumf3);
    }

    vsumf0 = vec_add(vsumf0, vsumf2);
    vsumf1 = vec_add(vsumf1, vsumf3);

    vsumf0 = vec_add(vsumf0, vsumf1);

    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 4));
    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 8));

    *s = vec_extract(vsumf0, 0);

#elif defined __loongarch_asx

    const __m128i m32 = __lsx_vreplgr2vr_b(32);

    __m256 acc = (__m256)__lasx_xvldi(0);

    uint32_t aux[3];

    for (int i = 0; i < nb; ++i) {

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;
        // Set up scales
        memcpy(aux, x[i].scales, 12);
        __m128i scales128 = lsx_set_w(
                ((aux[1] >> 4) & kmask2) | (((aux[2] >> 6) & kmask1) << 4),
                ((aux[0] >> 4) & kmask2) | (((aux[2] >> 4) & kmask1) << 4),
                (aux[1] & kmask2) | (((aux[2] >> 2) & kmask1) << 4),
                (aux[0] & kmask2) | (((aux[2] >> 0) & kmask1) << 4));
        scales128 = __lsx_vsub_b(scales128, m32);

        const v16i8 shuffle_mask = {0, 2, 4, 6, 8, 10, 12, 14, 1, 3, 5, 7, 9, 11, 13, 15};
        const __m256i scales_shuffled = lasx_ext8_16(__lsx_vshuf_b(scales128, scales128, (__m128i)shuffle_mask));

        // high bit
        const __m256i hbits = __lasx_xvld((const __m256i*)x[i].hmask, 0);

        // integer accumulator
        __m256i sumi = __lasx_xvldi(0);

        for (int j = 0; j < QK_K/128; ++j) {
            // load low 2 bits
            const __m256i q3bits = __lasx_xvld((const __m256i*)q3, 0); q3 += 32;

            // prepare low and high bits
            const __m256i q3l_0 = __lasx_xvandi_b(q3bits, 3);
            const __m256i q3l_1 = __lasx_xvandi_b(__lasx_xvsrli_b(q3bits, 2), 3);
            const __m256i q3l_2 = __lasx_xvandi_b(__lasx_xvsrli_b(q3bits, 4), 3);
            const __m256i q3l_3 = __lasx_xvsrli_b(q3bits, 6);
            const __m256i q3h_0 = __lasx_xvslli_b(__lasx_xvseqi_b(lasx_xvandi_b_bit(hbits, 4 * j + 0), 0), 2);
            const __m256i q3h_1 = __lasx_xvslli_b(__lasx_xvseqi_b(lasx_xvandi_b_bit(hbits, 4 * j + 1), 0), 2);
            const __m256i q3h_2 = __lasx_xvslli_b(__lasx_xvseqi_b(lasx_xvandi_b_bit(hbits, 4 * j + 2), 0), 2);
            const __m256i q3h_3 = __lasx_xvslli_b(__lasx_xvseqi_b(lasx_xvandi_b_bit(hbits, 4 * j + 3), 0), 2);
            const __m256i q3_0 = __lasx_xvor_v(q3h_0, q3l_0);
            const __m256i q3_1 = __lasx_xvor_v(q3h_1, q3l_1);
            const __m256i q3_2 = __lasx_xvor_v(q3h_2, q3l_2);
            const __m256i q3_3 = __lasx_xvor_v(q3h_3, q3l_3);

            // load Q8 quants
            const __m256i q8_0 = __lasx_xvld((const __m256i*)q8, 0); q8 += 32;
            const __m256i q8_1 = __lasx_xvld((const __m256i*)q8, 0); q8 += 32;
            const __m256i q8_2 = __lasx_xvld((const __m256i*)q8, 0); q8 += 32;
            const __m256i q8_3 = __lasx_xvld((const __m256i*)q8, 0); q8 += 32;

            __m256i p16_0 = lasx_madd_h_b(q8_0, q3_0);
            __m256i p16_1 = lasx_madd_h_b(q8_1, q3_1);
            __m256i p16_2 = lasx_madd_h_b(q8_2, q3_2);
            __m256i p16_3 = lasx_madd_h_b(q8_3, q3_3);

            // multiply with scales
            p16_0 = lasx_madd_h(lasx_xvrepl128vei_h(scales_shuffled, 4 * j + 0), p16_0);
            p16_1 = lasx_madd_h(lasx_xvrepl128vei_h(scales_shuffled, 4 * j + 1), p16_1);
            p16_2 = lasx_madd_h(lasx_xvrepl128vei_h(scales_shuffled, 4 * j + 2), p16_2);
            p16_3 = lasx_madd_h(lasx_xvrepl128vei_h(scales_shuffled, 4 * j + 3), p16_3);

            // accumulate
            p16_0 = __lasx_xvadd_w(p16_0, p16_1);
            p16_2 = __lasx_xvadd_w(p16_2, p16_3);
            sumi  = __lasx_xvadd_w(sumi, __lasx_xvadd_w(p16_0, p16_2));
        }
        // multiply with block scale and accumulate
        acc = __lasx_xvfmadd_s(__lasx_xvreplfr2vr_s(d), __lasx_xvffint_s_w(sumi), acc);
    }

    *s = hsum_float_8(acc);

#else
    // scalar version
    // This function is written like this so the compiler can manage to vectorize most of it
    // Using -Ofast, GCC and clang manage to produce code that is within a factor of 2 or so from the
    // manually vectorized version above. Every other version I tried would run at least 4 times slower.
    // The ideal situation would be if we could just write the code once, and the compiler would
    // automatically produce the best possible set of machine instructions, instead of us having to manually
    // write vectorized versions for AVX, ARM_NEON, etc.

    int8_t  aux8[QK_K];
    int16_t aux16[8];
    float   sums [8];
    int32_t aux32[8];
    memset(sums, 0, 8*sizeof(float));

    uint32_t auxs[4];
    const int8_t * scales = (const int8_t*)auxs;

    float sumf = 0;
    for (int i = 0; i < nb; ++i) {
        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const uint8_t * GGML_RESTRICT hm = x[i].hmask;
        const  int8_t * GGML_RESTRICT q8 = y[i].qs;
        memset(aux32, 0, 8*sizeof(int32_t));
        int8_t * GGML_RESTRICT a = aux8;
        uint8_t m = 1;
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) a[l] = q3[l] & 3;
            for (int l = 0; l < 32; ++l) a[l] -= (hm[l] & m ? 0 : 4);
            a += 32; m <<= 1;
            for (int l = 0; l < 32; ++l) a[l] = (q3[l] >> 2) & 3;
            for (int l = 0; l < 32; ++l) a[l] -= (hm[l] & m ? 0 : 4);
            a += 32; m <<= 1;
            for (int l = 0; l < 32; ++l) a[l] = (q3[l] >> 4) & 3;
            for (int l = 0; l < 32; ++l) a[l] -= (hm[l] & m ? 0 : 4);
            a += 32; m <<= 1;
            for (int l = 0; l < 32; ++l) a[l] = (q3[l] >> 6) & 3;
            for (int l = 0; l < 32; ++l) a[l] -= (hm[l] & m ? 0 : 4);
            a += 32; m <<= 1;
            q3 += 32;
        }
        a = aux8;

        memcpy(auxs, x[i].scales, 12);
        uint32_t tmp = auxs[2];
        auxs[2] = ((auxs[0] >> 4) & kmask2) | (((tmp >> 4) & kmask1) << 4);
        auxs[3] = ((auxs[1] >> 4) & kmask2) | (((tmp >> 6) & kmask1) << 4);
        auxs[0] = (auxs[0] & kmask2) | (((tmp >> 0) & kmask1) << 4);
        auxs[1] = (auxs[1] & kmask2) | (((tmp >> 2) & kmask1) << 4);
        for (int j = 0; j < QK_K/16; ++j) {
            for (int l = 0; l < 8; ++l) aux16[l] = q8[l] * a[l];
            for (int l = 0; l < 8; ++l) aux32[l] += (scales[j] - 32) * aux16[l];
            q8 += 8; a += 8;
            for (int l = 0; l < 8; ++l) aux16[l] = q8[l] * a[l];
            for (int l = 0; l < 8; ++l) aux32[l] += (scales[j] - 32) * aux16[l];
            q8 += 8; a += 8;
        }
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        for (int l = 0; l < 8; ++l) sums[l] += d * aux32[l];
    }
    for (int l = 0; l < 8; ++l) sumf += sums[l];
    *s = sumf;

#endif

}